

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  Primitive *pPVar3;
  undefined1 (*pauVar4) [16];
  Primitive PVar5;
  int iVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  undefined8 uVar10;
  undefined6 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  int iVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  ulong uVar35;
  undefined1 *puVar36;
  RTCFilterFunctionN p_Var37;
  RayHitK<4> *pRVar38;
  ulong uVar39;
  Geometry *pGVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  LinearSpace3fa *pLVar44;
  long lVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  short sVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  uint uVar56;
  undefined2 uVar90;
  float fVar91;
  float fVar95;
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  float fVar92;
  float fVar96;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  float fVar93;
  uint uVar94;
  float fVar97;
  uint uVar98;
  float fVar99;
  uint uVar100;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar101;
  float fVar128;
  float fVar129;
  vfloat4 v;
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar130;
  float fVar142;
  float fVar143;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar144;
  float fVar157;
  float fVar159;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar145;
  float fVar158;
  float fVar160;
  float fVar161;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar162;
  float fVar172;
  float fVar173;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar174;
  float fVar188;
  float fVar189;
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar190;
  float fVar195;
  float fVar196;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar215;
  float fVar218;
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  float fVar216;
  float fVar217;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar214 [16];
  float fVar223;
  float fVar226;
  float fVar227;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar228;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar229 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar246;
  float fVar248;
  undefined1 auVar239 [16];
  float fVar250;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar247;
  float fVar249;
  float fVar251;
  undefined1 auVar245 [16];
  float fVar252;
  float fVar253;
  float fVar257;
  float fVar259;
  float fVar261;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar258;
  float fVar260;
  float fVar262;
  undefined1 auVar256 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar267;
  float fVar270;
  float fVar271;
  float fVar273;
  undefined1 auVar268 [16];
  float fVar272;
  float fVar274;
  undefined1 auVar269 [16];
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  undefined1 local_518 [8];
  float fStack_510;
  undefined4 uStack_50c;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined4 uStack_4bc;
  float local_448;
  float fStack_444;
  float fStack_440;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  LinearSpace3fa *local_400;
  Precalculations *local_3f8;
  Primitive *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  RTCFilterFunctionNArguments local_368;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 (*local_318) [16];
  RayHitK<4> *local_310;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  uint local_218;
  int local_214;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  float local_1b8 [4];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 uVar89;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  
  PVar5 = prim[1];
  uVar35 = (ulong)(byte)PVar5;
  pPVar3 = prim + uVar35 * 0x19 + 6;
  fVar143 = *(float *)(pPVar3 + 0xc);
  fVar144 = (*(float *)(ray + k * 4) - *(float *)pPVar3) * fVar143;
  fVar157 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar3 + 4)) * fVar143;
  fVar159 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar3 + 8)) * fVar143;
  fVar130 = *(float *)(ray + k * 4 + 0x40) * fVar143;
  fVar142 = *(float *)(ray + k * 4 + 0x50) * fVar143;
  fVar143 = *(float *)(ray + k * 4 + 0x60) * fVar143;
  uVar34 = *(undefined4 *)(prim + uVar35 * 4 + 6);
  uVar89 = (undefined1)((uint)uVar34 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar34 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar34));
  uVar89 = (undefined1)((uint)uVar34 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar89),uVar89);
  sVar52 = CONCAT11((char)uVar34,(char)uVar34);
  uVar42 = CONCAT62(uVar11,sVar52);
  auVar132._8_4_ = 0;
  auVar132._0_8_ = uVar42;
  auVar132._12_2_ = uVar90;
  auVar132._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar180._12_4_ = auVar132._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar42;
  auVar180._10_2_ = uVar90;
  auVar181._10_6_ = auVar180._10_6_;
  auVar181._8_2_ = uVar90;
  auVar181._0_8_ = uVar42;
  uVar90 = (undefined2)uVar11;
  auVar12._4_8_ = auVar181._8_8_;
  auVar12._2_2_ = uVar90;
  auVar12._0_2_ = uVar90;
  fVar101 = (float)((int)sVar52 >> 8);
  fVar128 = (float)(auVar12._0_4_ >> 0x18);
  fVar129 = (float)(auVar181._8_4_ >> 0x18);
  uVar34 = *(undefined4 *)(prim + uVar35 * 5 + 6);
  uVar89 = (undefined1)((uint)uVar34 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar34 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar34));
  uVar89 = (undefined1)((uint)uVar34 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar89),uVar89);
  sVar52 = CONCAT11((char)uVar34,(char)uVar34);
  uVar42 = CONCAT62(uVar11,sVar52);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar42;
  auVar59._12_2_ = uVar90;
  auVar59._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar42;
  auVar58._10_2_ = uVar90;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._8_2_ = uVar90;
  auVar57._0_8_ = uVar42;
  uVar90 = (undefined2)uVar11;
  auVar13._4_8_ = auVar57._8_8_;
  auVar13._2_2_ = uVar90;
  auVar13._0_2_ = uVar90;
  fVar162 = (float)((int)sVar52 >> 8);
  fVar172 = (float)(auVar13._0_4_ >> 0x18);
  fVar173 = (float)(auVar57._8_4_ >> 0x18);
  uVar34 = *(undefined4 *)(prim + uVar35 * 6 + 6);
  uVar89 = (undefined1)((uint)uVar34 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar34 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar34));
  uVar89 = (undefined1)((uint)uVar34 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar89),uVar89);
  sVar52 = CONCAT11((char)uVar34,(char)uVar34);
  uVar42 = CONCAT62(uVar11,sVar52);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar42;
  auVar62._12_2_ = uVar90;
  auVar62._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar42;
  auVar61._10_2_ = uVar90;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar90;
  auVar60._0_8_ = uVar42;
  uVar90 = (undefined2)uVar11;
  auVar14._4_8_ = auVar60._8_8_;
  auVar14._2_2_ = uVar90;
  auVar14._0_2_ = uVar90;
  fVar190 = (float)((int)sVar52 >> 8);
  fVar195 = (float)(auVar14._0_4_ >> 0x18);
  fVar196 = (float)(auVar60._8_4_ >> 0x18);
  uVar34 = *(undefined4 *)(prim + uVar35 * 0xb + 6);
  uVar89 = (undefined1)((uint)uVar34 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar34 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar34));
  uVar89 = (undefined1)((uint)uVar34 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar89),uVar89);
  sVar52 = CONCAT11((char)uVar34,(char)uVar34);
  uVar42 = CONCAT62(uVar11,sVar52);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar42;
  auVar65._12_2_ = uVar90;
  auVar65._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar42;
  auVar64._10_2_ = uVar90;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar90;
  auVar63._0_8_ = uVar42;
  uVar90 = (undefined2)uVar11;
  auVar15._4_8_ = auVar63._8_8_;
  auVar15._2_2_ = uVar90;
  auVar15._0_2_ = uVar90;
  fVar53 = (float)((int)sVar52 >> 8);
  fVar91 = (float)(auVar15._0_4_ >> 0x18);
  fVar95 = (float)(auVar63._8_4_ >> 0x18);
  uVar34 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar89 = (undefined1)((uint)uVar34 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar34 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar34));
  uVar89 = (undefined1)((uint)uVar34 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar89),uVar89);
  sVar52 = CONCAT11((char)uVar34,(char)uVar34);
  uVar42 = CONCAT62(uVar11,sVar52);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar42;
  auVar177._12_2_ = uVar90;
  auVar177._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar42;
  auVar176._10_2_ = uVar90;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar90;
  auVar175._0_8_ = uVar42;
  uVar90 = (undefined2)uVar11;
  auVar16._4_8_ = auVar175._8_8_;
  auVar16._2_2_ = uVar90;
  auVar16._0_2_ = uVar90;
  fVar174 = (float)((int)sVar52 >> 8);
  fVar188 = (float)(auVar16._0_4_ >> 0x18);
  fVar189 = (float)(auVar175._8_4_ >> 0x18);
  uVar34 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar35 + 6);
  uVar89 = (undefined1)((uint)uVar34 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar34 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar34));
  uVar89 = (undefined1)((uint)uVar34 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar89),uVar89);
  sVar52 = CONCAT11((char)uVar34,(char)uVar34);
  uVar42 = CONCAT62(uVar11,sVar52);
  auVar202._8_4_ = 0;
  auVar202._0_8_ = uVar42;
  auVar202._12_2_ = uVar90;
  auVar202._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._8_2_ = 0;
  auVar201._0_8_ = uVar42;
  auVar201._10_2_ = uVar90;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._8_2_ = uVar90;
  auVar200._0_8_ = uVar42;
  uVar90 = (undefined2)uVar11;
  auVar17._4_8_ = auVar200._8_8_;
  auVar17._2_2_ = uVar90;
  auVar17._0_2_ = uVar90;
  fVar228 = (float)((int)sVar52 >> 8);
  fVar230 = (float)(auVar17._0_4_ >> 0x18);
  fVar231 = (float)(auVar200._8_4_ >> 0x18);
  uVar43 = (ulong)(uint)((int)(uVar35 * 9) * 2);
  uVar34 = *(undefined4 *)(prim + uVar43 + 6);
  uVar89 = (undefined1)((uint)uVar34 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar34 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar34));
  uVar89 = (undefined1)((uint)uVar34 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar89),uVar89);
  sVar52 = CONCAT11((char)uVar34,(char)uVar34);
  uVar42 = CONCAT62(uVar11,sVar52);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar42;
  auVar205._12_2_ = uVar90;
  auVar205._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._8_2_ = 0;
  auVar204._0_8_ = uVar42;
  auVar204._10_2_ = uVar90;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = uVar90;
  auVar203._0_8_ = uVar42;
  uVar90 = (undefined2)uVar11;
  auVar18._4_8_ = auVar203._8_8_;
  auVar18._2_2_ = uVar90;
  auVar18._0_2_ = uVar90;
  fVar223 = (float)((int)sVar52 >> 8);
  fVar226 = (float)(auVar18._0_4_ >> 0x18);
  fVar227 = (float)(auVar203._8_4_ >> 0x18);
  uVar34 = *(undefined4 *)(prim + uVar43 + uVar35 + 6);
  uVar89 = (undefined1)((uint)uVar34 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar34 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar34));
  uVar89 = (undefined1)((uint)uVar34 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar89),uVar89);
  sVar52 = CONCAT11((char)uVar34,(char)uVar34);
  uVar42 = CONCAT62(uVar11,sVar52);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar42;
  auVar208._12_2_ = uVar90;
  auVar208._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar42;
  auVar207._10_2_ = uVar90;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar90;
  auVar206._0_8_ = uVar42;
  uVar90 = (undefined2)uVar11;
  auVar19._4_8_ = auVar206._8_8_;
  auVar19._2_2_ = uVar90;
  auVar19._0_2_ = uVar90;
  fVar234 = (float)((int)sVar52 >> 8);
  fVar235 = (float)(auVar19._0_4_ >> 0x18);
  fVar236 = (float)(auVar206._8_4_ >> 0x18);
  uVar39 = (ulong)(uint)((int)(uVar35 * 5) << 2);
  uVar34 = *(undefined4 *)(prim + uVar39 + 6);
  uVar89 = (undefined1)((uint)uVar34 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar34 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar34));
  uVar89 = (undefined1)((uint)uVar34 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar89),uVar89);
  sVar52 = CONCAT11((char)uVar34,(char)uVar34);
  uVar42 = CONCAT62(uVar11,sVar52);
  auVar241._8_4_ = 0;
  auVar241._0_8_ = uVar42;
  auVar241._12_2_ = uVar90;
  auVar241._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar240._12_4_ = auVar241._12_4_;
  auVar240._8_2_ = 0;
  auVar240._0_8_ = uVar42;
  auVar240._10_2_ = uVar90;
  auVar239._10_6_ = auVar240._10_6_;
  auVar239._8_2_ = uVar90;
  auVar239._0_8_ = uVar42;
  uVar90 = (undefined2)uVar11;
  auVar20._4_8_ = auVar239._8_8_;
  auVar20._2_2_ = uVar90;
  auVar20._0_2_ = uVar90;
  fVar54 = (float)((int)sVar52 >> 8);
  fVar92 = (float)(auVar20._0_4_ >> 0x18);
  fVar96 = (float)(auVar239._8_4_ >> 0x18);
  fVar252 = fVar130 * fVar101 + fVar142 * fVar162 + fVar143 * fVar190;
  fVar257 = fVar130 * fVar128 + fVar142 * fVar172 + fVar143 * fVar195;
  fVar259 = fVar130 * fVar129 + fVar142 * fVar173 + fVar143 * fVar196;
  fVar261 = fVar130 * (float)(auVar180._12_4_ >> 0x18) +
            fVar142 * (float)(auVar58._12_4_ >> 0x18) + fVar143 * (float)(auVar61._12_4_ >> 0x18);
  fVar237 = fVar130 * fVar53 + fVar142 * fVar174 + fVar143 * fVar228;
  fVar246 = fVar130 * fVar91 + fVar142 * fVar188 + fVar143 * fVar230;
  fVar248 = fVar130 * fVar95 + fVar142 * fVar189 + fVar143 * fVar231;
  fVar250 = fVar130 * (float)(auVar64._12_4_ >> 0x18) +
            fVar142 * (float)(auVar176._12_4_ >> 0x18) + fVar143 * (float)(auVar201._12_4_ >> 0x18);
  fVar197 = fVar130 * fVar223 + fVar142 * fVar234 + fVar143 * fVar54;
  fVar215 = fVar130 * fVar226 + fVar142 * fVar235 + fVar143 * fVar92;
  fVar218 = fVar130 * fVar227 + fVar142 * fVar236 + fVar143 * fVar96;
  fVar130 = fVar130 * (float)(auVar204._12_4_ >> 0x18) +
            fVar142 * (float)(auVar207._12_4_ >> 0x18) + fVar143 * (float)(auVar240._12_4_ >> 0x18);
  uVar34 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar162 = fVar101 * fVar144 + fVar162 * fVar157 + fVar190 * fVar159;
  fVar172 = fVar128 * fVar144 + fVar172 * fVar157 + fVar195 * fVar159;
  fVar173 = fVar129 * fVar144 + fVar173 * fVar157 + fVar196 * fVar159;
  fVar190 = (float)(auVar180._12_4_ >> 0x18) * fVar144 +
            (float)(auVar58._12_4_ >> 0x18) * fVar157 + (float)(auVar61._12_4_ >> 0x18) * fVar159;
  fVar195 = fVar53 * fVar144 + fVar174 * fVar157 + fVar228 * fVar159;
  fVar196 = fVar91 * fVar144 + fVar188 * fVar157 + fVar230 * fVar159;
  fVar228 = fVar95 * fVar144 + fVar189 * fVar157 + fVar231 * fVar159;
  fVar230 = (float)(auVar64._12_4_ >> 0x18) * fVar144 +
            (float)(auVar176._12_4_ >> 0x18) * fVar157 + (float)(auVar201._12_4_ >> 0x18) * fVar159;
  fVar174 = fVar144 * fVar223 + fVar157 * fVar234 + fVar159 * fVar54;
  fVar188 = fVar144 * fVar226 + fVar157 * fVar235 + fVar159 * fVar92;
  fVar189 = fVar144 * fVar227 + fVar157 * fVar236 + fVar159 * fVar96;
  fVar144 = fVar144 * (float)(auVar204._12_4_ >> 0x18) +
            fVar157 * (float)(auVar207._12_4_ >> 0x18) + fVar159 * (float)(auVar240._12_4_ >> 0x18);
  fVar143 = (float)DAT_01f80d30;
  fVar53 = DAT_01f80d30._4_4_;
  fVar54 = DAT_01f80d30._8_4_;
  fVar91 = DAT_01f80d30._12_4_;
  uVar46 = -(uint)(fVar143 <= ABS(fVar252));
  uVar47 = -(uint)(fVar53 <= ABS(fVar257));
  uVar48 = -(uint)(fVar54 <= ABS(fVar259));
  uVar50 = -(uint)(fVar91 <= ABS(fVar261));
  auVar254._0_4_ = (uint)fVar252 & uVar46;
  auVar254._4_4_ = (uint)fVar257 & uVar47;
  auVar254._8_4_ = (uint)fVar259 & uVar48;
  auVar254._12_4_ = (uint)fVar261 & uVar50;
  auVar163._0_4_ = ~uVar46 & (uint)fVar143;
  auVar163._4_4_ = ~uVar47 & (uint)fVar53;
  auVar163._8_4_ = ~uVar48 & (uint)fVar54;
  auVar163._12_4_ = ~uVar50 & (uint)fVar91;
  auVar163 = auVar163 | auVar254;
  uVar46 = -(uint)(fVar143 <= ABS(fVar237));
  uVar47 = -(uint)(fVar53 <= ABS(fVar246));
  uVar48 = -(uint)(fVar54 <= ABS(fVar248));
  uVar50 = -(uint)(fVar91 <= ABS(fVar250));
  auVar242._0_4_ = (uint)fVar237 & uVar46;
  auVar242._4_4_ = (uint)fVar246 & uVar47;
  auVar242._8_4_ = (uint)fVar248 & uVar48;
  auVar242._12_4_ = (uint)fVar250 & uVar50;
  auVar178._0_4_ = ~uVar46 & (uint)fVar143;
  auVar178._4_4_ = ~uVar47 & (uint)fVar53;
  auVar178._8_4_ = ~uVar48 & (uint)fVar54;
  auVar178._12_4_ = ~uVar50 & (uint)fVar91;
  auVar178 = auVar178 | auVar242;
  uVar46 = -(uint)(fVar143 <= ABS(fVar197));
  uVar47 = -(uint)(fVar53 <= ABS(fVar215));
  uVar48 = -(uint)(fVar54 <= ABS(fVar218));
  uVar50 = -(uint)(fVar91 <= ABS(fVar130));
  auVar209._0_4_ = (uint)fVar197 & uVar46;
  auVar209._4_4_ = (uint)fVar215 & uVar47;
  auVar209._8_4_ = (uint)fVar218 & uVar48;
  auVar209._12_4_ = (uint)fVar130 & uVar50;
  auVar191._0_4_ = ~uVar46 & (uint)fVar143;
  auVar191._4_4_ = ~uVar47 & (uint)fVar53;
  auVar191._8_4_ = ~uVar48 & (uint)fVar54;
  auVar191._12_4_ = ~uVar50 & (uint)fVar91;
  auVar191 = auVar191 | auVar209;
  auVar66 = rcpps(_DAT_01f80d30,auVar163);
  fVar143 = auVar66._0_4_;
  fVar91 = auVar66._4_4_;
  fVar96 = auVar66._8_4_;
  fVar129 = auVar66._12_4_;
  fVar143 = (1.0 - auVar163._0_4_ * fVar143) * fVar143 + fVar143;
  fVar91 = (1.0 - auVar163._4_4_ * fVar91) * fVar91 + fVar91;
  fVar96 = (1.0 - auVar163._8_4_ * fVar96) * fVar96 + fVar96;
  fVar129 = (1.0 - auVar163._12_4_ * fVar129) * fVar129 + fVar129;
  auVar66 = rcpps(auVar66,auVar178);
  fVar53 = auVar66._0_4_;
  fVar92 = auVar66._4_4_;
  fVar101 = auVar66._8_4_;
  fVar130 = auVar66._12_4_;
  fVar53 = (1.0 - auVar178._0_4_ * fVar53) * fVar53 + fVar53;
  fVar92 = (1.0 - auVar178._4_4_ * fVar92) * fVar92 + fVar92;
  fVar101 = (1.0 - auVar178._8_4_ * fVar101) * fVar101 + fVar101;
  fVar130 = (1.0 - auVar178._12_4_ * fVar130) * fVar130 + fVar130;
  auVar66 = rcpps(auVar66,auVar191);
  fVar54 = auVar66._0_4_;
  fVar95 = auVar66._4_4_;
  fVar128 = auVar66._8_4_;
  fVar142 = auVar66._12_4_;
  fVar54 = (1.0 - auVar191._0_4_ * fVar54) * fVar54 + fVar54;
  fVar95 = (1.0 - auVar191._4_4_ * fVar95) * fVar95 + fVar95;
  fVar128 = (1.0 - auVar191._8_4_ * fVar128) * fVar128 + fVar128;
  fVar142 = (1.0 - auVar191._12_4_ * fVar142) * fVar142 + fVar142;
  uVar42 = *(ulong *)(prim + uVar35 * 7 + 6);
  uVar90 = (undefined2)(uVar42 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar42;
  auVar69._12_2_ = uVar90;
  auVar69._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar42 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar42;
  auVar68._10_2_ = uVar90;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar90;
  auVar67._0_8_ = uVar42;
  uVar90 = (undefined2)(uVar42 >> 0x10);
  auVar21._4_8_ = auVar67._8_8_;
  auVar21._2_2_ = uVar90;
  auVar21._0_2_ = uVar90;
  auVar164._0_8_ =
       CONCAT44(((float)(auVar21._0_4_ >> 0x10) - fVar172) * fVar91,
                ((float)(int)(short)uVar42 - fVar162) * fVar143);
  auVar164._8_4_ = ((float)(auVar67._8_4_ >> 0x10) - fVar173) * fVar96;
  auVar164._12_4_ = ((float)(auVar68._12_4_ >> 0x10) - fVar190) * fVar129;
  uVar42 = *(ulong *)(prim + uVar35 * 9 + 6);
  uVar90 = (undefined2)(uVar42 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar42;
  auVar72._12_2_ = uVar90;
  auVar72._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar42 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar42;
  auVar71._10_2_ = uVar90;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar90;
  auVar70._0_8_ = uVar42;
  uVar90 = (undefined2)(uVar42 >> 0x10);
  auVar22._4_8_ = auVar70._8_8_;
  auVar22._2_2_ = uVar90;
  auVar22._0_2_ = uVar90;
  auVar66._0_4_ = ((float)(int)(short)uVar42 - fVar162) * fVar143;
  auVar66._4_4_ = ((float)(auVar22._0_4_ >> 0x10) - fVar172) * fVar91;
  auVar66._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar173) * fVar96;
  auVar66._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar190) * fVar129;
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar43 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar35 * -2 + 6);
  uVar90 = (undefined2)(uVar43 >> 0x30);
  auVar104._8_4_ = 0;
  auVar104._0_8_ = uVar43;
  auVar104._12_2_ = uVar90;
  auVar104._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar43 >> 0x20);
  auVar103._12_4_ = auVar104._12_4_;
  auVar103._8_2_ = 0;
  auVar103._0_8_ = uVar43;
  auVar103._10_2_ = uVar90;
  auVar102._10_6_ = auVar103._10_6_;
  auVar102._8_2_ = uVar90;
  auVar102._0_8_ = uVar43;
  uVar90 = (undefined2)(uVar43 >> 0x10);
  auVar23._4_8_ = auVar102._8_8_;
  auVar23._2_2_ = uVar90;
  auVar23._0_2_ = uVar90;
  auVar105._0_8_ =
       CONCAT44(((float)(auVar23._0_4_ >> 0x10) - fVar196) * fVar92,
                ((float)(int)(short)uVar43 - fVar195) * fVar53);
  auVar105._8_4_ = ((float)(auVar102._8_4_ >> 0x10) - fVar228) * fVar101;
  auVar105._12_4_ = ((float)(auVar103._12_4_ >> 0x10) - fVar230) * fVar130;
  uVar90 = (undefined2)(uVar42 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar42;
  auVar75._12_2_ = uVar90;
  auVar75._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar42 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar42;
  auVar74._10_2_ = uVar90;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar90;
  auVar73._0_8_ = uVar42;
  uVar90 = (undefined2)(uVar42 >> 0x10);
  auVar24._4_8_ = auVar73._8_8_;
  auVar24._2_2_ = uVar90;
  auVar24._0_2_ = uVar90;
  auVar224._0_4_ = ((float)(int)(short)uVar42 - fVar195) * fVar53;
  auVar224._4_4_ = ((float)(auVar24._0_4_ >> 0x10) - fVar196) * fVar92;
  auVar224._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar228) * fVar101;
  auVar224._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar230) * fVar130;
  uVar42 = *(ulong *)(prim + uVar39 + uVar35 + 6);
  uVar90 = (undefined2)(uVar42 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar42;
  auVar78._12_2_ = uVar90;
  auVar78._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar42 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar42;
  auVar77._10_2_ = uVar90;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar90;
  auVar76._0_8_ = uVar42;
  uVar90 = (undefined2)(uVar42 >> 0x10);
  auVar25._4_8_ = auVar76._8_8_;
  auVar25._2_2_ = uVar90;
  auVar25._0_2_ = uVar90;
  auVar79._0_8_ =
       CONCAT44(((float)(auVar25._0_4_ >> 0x10) - fVar188) * fVar95,
                ((float)(int)(short)uVar42 - fVar174) * fVar54);
  auVar79._8_4_ = ((float)(auVar76._8_4_ >> 0x10) - fVar189) * fVar128;
  auVar79._12_4_ = ((float)(auVar77._12_4_ >> 0x10) - fVar144) * fVar142;
  uVar42 = *(ulong *)(prim + uVar35 * 0x17 + 6);
  uVar90 = (undefined2)(uVar42 >> 0x30);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar42;
  auVar212._12_2_ = uVar90;
  auVar212._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar42 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar42;
  auVar211._10_2_ = uVar90;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar90;
  auVar210._0_8_ = uVar42;
  uVar90 = (undefined2)(uVar42 >> 0x10);
  auVar26._4_8_ = auVar210._8_8_;
  auVar26._2_2_ = uVar90;
  auVar26._0_2_ = uVar90;
  auVar213._0_4_ = ((float)(int)(short)uVar42 - fVar174) * fVar54;
  auVar213._4_4_ = ((float)(auVar26._0_4_ >> 0x10) - fVar188) * fVar95;
  auVar213._8_4_ = ((float)(auVar210._8_4_ >> 0x10) - fVar189) * fVar128;
  auVar213._12_4_ = ((float)(auVar211._12_4_ >> 0x10) - fVar144) * fVar142;
  auVar179._8_4_ = auVar164._8_4_;
  auVar179._0_8_ = auVar164._0_8_;
  auVar179._12_4_ = auVar164._12_4_;
  auVar180 = minps(auVar179,auVar66);
  auVar131._8_4_ = auVar105._8_4_;
  auVar131._0_8_ = auVar105._0_8_;
  auVar131._12_4_ = auVar105._12_4_;
  auVar132 = minps(auVar131,auVar224);
  auVar180 = maxps(auVar180,auVar132);
  auVar133._8_4_ = auVar79._8_4_;
  auVar133._0_8_ = auVar79._0_8_;
  auVar133._12_4_ = auVar79._12_4_;
  auVar132 = minps(auVar133,auVar213);
  auVar146._4_4_ = uVar34;
  auVar146._0_4_ = uVar34;
  auVar146._8_4_ = uVar34;
  auVar146._12_4_ = uVar34;
  auVar132 = maxps(auVar132,auVar146);
  auVar181 = maxps(auVar180,auVar132);
  auVar180 = maxps(auVar164,auVar66);
  auVar132 = maxps(auVar105,auVar224);
  auVar180 = minps(auVar180,auVar132);
  local_48 = auVar181._0_4_ * 0.99999964;
  fStack_44 = auVar181._4_4_ * 0.99999964;
  fStack_40 = auVar181._8_4_ * 0.99999964;
  fStack_3c = auVar181._12_4_ * 0.99999964;
  auVar132 = maxps(auVar79,auVar213);
  uVar34 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar106._4_4_ = uVar34;
  auVar106._0_4_ = uVar34;
  auVar106._8_4_ = uVar34;
  auVar106._12_4_ = uVar34;
  auVar132 = minps(auVar132,auVar106);
  auVar132 = minps(auVar180,auVar132);
  fVar143 = auVar132._0_4_ * 1.0000004;
  fVar53 = auVar132._4_4_ * 1.0000004;
  fVar54 = auVar132._8_4_ * 1.0000004;
  fVar91 = auVar132._12_4_ * 1.0000004;
  auVar107._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_48 <= fVar143);
  auVar107._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_44 <= fVar53);
  auVar107._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_40 <= fVar54);
  auVar107._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_3c <= fVar91);
  uVar46 = movmskps((uint)(byte)PVar5,auVar107);
  if (uVar46 != 0) {
    uVar46 = uVar46 & 0xff;
    pLVar44 = pre->ray_space + k;
    local_3e8 = mm_lookupmask_ps._0_8_;
    uStack_3e0 = mm_lookupmask_ps._8_8_;
    local_318 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_400 = pLVar44;
    local_3f8 = pre;
    local_3f0 = prim;
    local_310 = ray;
    do {
      uVar42 = (ulong)uVar46;
      lVar9 = 0;
      if (uVar42 != 0) {
        for (; (uVar46 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
        }
      }
      uVar42 = uVar42 - 1 & uVar42;
      uVar46 = *(uint *)(prim + 2);
      uVar47 = *(uint *)(prim + lVar9 * 4 + 6);
      pGVar7 = (context->scene->geometries).items[uVar46].ptr;
      _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      uVar43 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 + _Var8 * uVar47);
      pGVar40 = (Geometry *)pGVar7[1].intersectionFilterN;
      lVar9 = *(long *)&pGVar7[1].time_range.upper;
      pfVar1 = (float *)(lVar9 + (long)pGVar40 * uVar43);
      local_3b8 = *pfVar1;
      fStack_3b4 = pfVar1[1];
      local_208 = *(undefined8 *)pfVar1;
      fStack_3b0 = pfVar1[2];
      fStack_3ac = pfVar1[3];
      uStack_200 = *(undefined8 *)(pfVar1 + 2);
      pfVar1 = (float *)(lVar9 + (uVar43 + 1) * (long)pGVar40);
      fVar92 = *pfVar1;
      fVar95 = pfVar1[1];
      fVar96 = pfVar1[2];
      fVar101 = pfVar1[3];
      pfVar1 = (float *)(lVar9 + (uVar43 + 2) * (long)pGVar40);
      local_3c8 = *pfVar1;
      fStack_3c4 = pfVar1[1];
      local_1e8 = *(undefined8 *)pfVar1;
      fStack_3c0 = pfVar1[2];
      fStack_3bc = pfVar1[3];
      uStack_1e0 = *(undefined8 *)(pfVar1 + 2);
      lVar41 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
        }
      }
      pfVar1 = (float *)(lVar9 + (uVar43 + 3) * (long)pGVar40);
      local_3d8 = *pfVar1;
      fStack_3d4 = pfVar1[1];
      local_1d8 = *(undefined8 *)pfVar1;
      fStack_3d0 = pfVar1[2];
      fStack_3cc = pfVar1[3];
      uStack_1d0 = *(undefined8 *)(pfVar1 + 2);
      if ((uVar42 != 0) && (uVar43 = uVar42 - 1 & uVar42, uVar43 != 0)) {
        lVar9 = 0;
        if (uVar43 != 0) {
          for (; (uVar43 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        pGVar40 = (Geometry *)
                  ((long)pGVar40 *
                  (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                                  _Var8 * *(uint *)(prim + lVar9 * 4 + 6)));
      }
      iVar6 = (int)pGVar7[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar128 = *(float *)(ray + k * 4);
      fVar129 = *(float *)(ray + k * 4 + 0x10);
      fVar130 = *(float *)(ray + k * 4 + 0x20);
      fVar157 = local_3b8 - fVar128;
      fVar159 = fStack_3b4 - fVar129;
      fVar195 = fStack_3b0 - fVar130;
      fVar142 = (pLVar44->vx).field_0.m128[0];
      fVar162 = (pLVar44->vx).field_0.m128[1];
      fVar172 = (pLVar44->vx).field_0.m128[2];
      fVar173 = (pLVar44->vy).field_0.m128[0];
      fVar190 = (pLVar44->vy).field_0.m128[1];
      fVar174 = (pLVar44->vy).field_0.m128[2];
      fVar188 = (pLVar44->vz).field_0.m128[0];
      fVar189 = (pLVar44->vz).field_0.m128[1];
      fVar144 = (pLVar44->vz).field_0.m128[2];
      local_138 = fVar157 * fVar142 + fVar159 * fVar173 + fVar195 * fVar188;
      local_188 = fVar157 * fVar162 + fVar159 * fVar190 + fVar195 * fVar189;
      fVar196 = fVar157 * fVar172 + fVar159 * fVar174 + fVar195 * fVar144;
      fVar157 = fVar92 - fVar128;
      fVar159 = fVar95 - fVar129;
      fVar195 = fVar96 - fVar130;
      local_2e8 = fVar157 * fVar142 + fVar159 * fVar173 + fVar195 * fVar188;
      local_398 = fVar157 * fVar162 + fVar159 * fVar190 + fVar195 * fVar189;
      local_378 = fVar157 * fVar172 + fVar159 * fVar174 + fVar195 * fVar144;
      fVar157 = local_3c8 - fVar128;
      fVar159 = fStack_3c4 - fVar129;
      fVar195 = fStack_3c0 - fVar130;
      fVar197 = fVar157 * fVar142 + fVar159 * fVar173 + fVar195 * fVar188;
      local_328 = fVar157 * fVar162 + fVar159 * fVar190 + fVar195 * fVar189;
      local_2c8 = fVar157 * fVar172 + fVar159 * fVar174 + fVar195 * fVar144;
      fVar128 = local_3d8 - fVar128;
      fVar129 = fStack_3d4 - fVar129;
      fVar130 = fStack_3d0 - fVar130;
      fVar142 = fVar128 * fVar142 + fVar129 * fVar173 + fVar130 * fVar188;
      local_2d8 = fVar128 * fVar162 + fVar129 * fVar190 + fVar130 * fVar189;
      fVar129 = fVar128 * fVar172 + fVar129 * fVar174 + fVar130 * fVar144;
      auVar243._0_8_ = CONCAT44(local_188,local_138) & 0x7fffffff7fffffff;
      auVar243._8_4_ = ABS(fVar196);
      auVar243._12_4_ = ABS(fStack_3ac);
      auVar165._0_8_ = CONCAT44(local_398,local_2e8) & 0x7fffffff7fffffff;
      auVar165._8_4_ = ABS(local_378);
      auVar165._12_4_ = ABS(fVar101);
      auVar180 = maxps(auVar243,auVar165);
      auVar182._0_8_ = CONCAT44(local_328,fVar197) & 0x7fffffff7fffffff;
      auVar182._8_4_ = ABS(local_2c8);
      auVar182._12_4_ = ABS(fStack_3bc);
      auVar108._0_8_ = CONCAT44(local_2d8,fVar142) & 0x7fffffff7fffffff;
      auVar108._8_4_ = ABS(fVar129);
      auVar108._12_4_ = ABS(fStack_3cc);
      auVar132 = maxps(auVar182,auVar108);
      auVar132 = maxps(auVar180,auVar132);
      fVar128 = auVar132._4_4_;
      if (auVar132._4_4_ <= auVar132._0_4_) {
        fVar128 = auVar132._0_4_;
      }
      auVar244._8_8_ = auVar132._8_8_;
      auVar244._0_8_ = auVar132._8_8_;
      fVar130 = (float)iVar6;
      _local_308 = ZEXT416((uint)fVar130);
      if (auVar132._8_4_ <= fVar128) {
        auVar244._0_4_ = fVar128;
      }
      lVar9 = (long)iVar6 * 0x44;
      fVar128 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar9 + 0x908);
      fVar162 = *(float *)(catmullrom_basis0 + lVar9 + 0x90c);
      fVar172 = *(float *)(catmullrom_basis0 + lVar9 + 0x910);
      auVar12 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar9 + 0x908);
      fVar173 = *(float *)(catmullrom_basis0 + lVar9 + 0x914);
      fVar190 = *(float *)(catmullrom_basis0 + lVar9 + 0xd8c);
      fVar174 = *(float *)(catmullrom_basis0 + lVar9 + 0xd90);
      fVar188 = *(float *)(catmullrom_basis0 + lVar9 + 0xd94);
      fVar189 = *(float *)(catmullrom_basis0 + lVar9 + 0xd98);
      fVar144 = *(float *)(catmullrom_basis0 + lVar9 + 0x484);
      fVar157 = *(float *)(catmullrom_basis0 + lVar9 + 0x488);
      fVar159 = *(float *)(catmullrom_basis0 + lVar9 + 0x48c);
      fVar195 = *(float *)(catmullrom_basis0 + lVar9 + 0x490);
      local_278 = *(float *)(catmullrom_basis0 + lVar9);
      fStack_274 = *(float *)(catmullrom_basis0 + lVar9 + 4);
      fStack_270 = *(float *)(catmullrom_basis0 + lVar9 + 8);
      fStack_26c = *(float *)(catmullrom_basis0 + lVar9 + 0xc);
      local_258 = local_138 * local_278 +
                  local_2e8 * fVar144 + fVar197 * fVar128 + fVar142 * fVar190;
      fStack_254 = local_138 * fStack_274 +
                   local_2e8 * fVar157 + fVar197 * fVar162 + fVar142 * fVar174;
      fStack_250 = local_138 * fStack_270 +
                   local_2e8 * fVar159 + fVar197 * fVar172 + fVar142 * fVar188;
      fStack_24c = local_138 * fStack_26c +
                   local_2e8 * fVar195 + fVar197 * fVar173 + fVar142 * fVar189;
      local_268 = local_188 * local_278 +
                  local_398 * fVar144 + local_328 * fVar128 + local_2d8 * fVar190;
      fStack_264 = local_188 * fStack_274 +
                   local_398 * fVar157 + local_328 * fVar162 + local_2d8 * fVar174;
      fStack_260 = local_188 * fStack_270 +
                   local_398 * fVar159 + local_328 * fVar172 + local_2d8 * fVar188;
      fStack_25c = local_188 * fStack_26c +
                   local_398 * fVar195 + local_328 * fVar173 + local_2d8 * fVar189;
      auVar134._0_4_ =
           fStack_3ac * local_278 + fVar101 * fVar144 + fStack_3bc * fVar128 + fStack_3cc * fVar190;
      auVar134._4_4_ =
           fStack_3ac * fStack_274 + fVar101 * fVar157 + fStack_3bc * fVar162 + fStack_3cc * fVar174
      ;
      auVar134._8_4_ =
           fStack_3ac * fStack_270 + fVar101 * fVar159 + fStack_3bc * fVar172 + fStack_3cc * fVar188
      ;
      auVar134._12_4_ =
           fStack_3ac * fStack_26c + fVar101 * fVar195 + fStack_3bc * fVar173 + fStack_3cc * fVar189
      ;
      fVar128 = *(float *)*(undefined1 (*) [12])(catmullrom_basis1 + lVar9 + 0xd8c);
      fVar162 = *(float *)(catmullrom_basis1 + lVar9 + 0xd90);
      fVar172 = *(float *)(catmullrom_basis1 + lVar9 + 0xd94);
      auVar13 = *(undefined1 (*) [12])(catmullrom_basis1 + lVar9 + 0xd8c);
      fVar215 = *(float *)(catmullrom_basis1 + lVar9 + 0xd98);
      pauVar4 = (undefined1 (*) [16])(catmullrom_basis1 + lVar9 + 0x908);
      fVar218 = *(float *)*pauVar4;
      fVar223 = *(float *)(catmullrom_basis1 + lVar9 + 0x90c);
      fVar226 = *(float *)(catmullrom_basis1 + lVar9 + 0x910);
      auVar14 = *(undefined1 (*) [12])*pauVar4;
      fVar227 = *(float *)(catmullrom_basis1 + lVar9 + 0x914);
      local_158 = fStack_3cc;
      fStack_154 = fStack_3cc;
      fStack_150 = fStack_3cc;
      fStack_14c = fStack_3cc;
      local_148 = fStack_3bc;
      fStack_144 = fStack_3bc;
      fStack_140 = fStack_3bc;
      fStack_13c = fStack_3bc;
      fVar228 = *(float *)(catmullrom_basis1 + lVar9 + 0x484);
      fVar230 = *(float *)(catmullrom_basis1 + lVar9 + 0x488);
      fVar231 = *(float *)(catmullrom_basis1 + lVar9 + 0x48c);
      fVar234 = *(float *)(catmullrom_basis1 + lVar9 + 0x490);
      local_168 = fVar101;
      fStack_164 = fVar101;
      fStack_160 = fVar101;
      fStack_15c = fVar101;
      fVar235 = *(float *)(catmullrom_basis1 + lVar9);
      fVar236 = *(float *)(catmullrom_basis1 + lVar9 + 4);
      fVar237 = *(float *)(catmullrom_basis1 + lVar9 + 8);
      fVar246 = *(float *)(catmullrom_basis1 + lVar9 + 0xc);
      fStack_134 = local_138;
      fStack_130 = local_138;
      fStack_12c = local_138;
      local_2f8._0_4_ =
           local_138 * fVar235 + local_2e8 * fVar228 + fVar197 * fVar218 + fVar142 * fVar128;
      local_2f8._4_4_ =
           local_138 * fVar236 + local_2e8 * fVar230 + fVar197 * fVar223 + fVar142 * fVar162;
      fStack_2f0 = local_138 * fVar237 + local_2e8 * fVar231 + fVar197 * fVar226 + fVar142 * fVar172
      ;
      fStack_2ec = local_138 * fVar246 + local_2e8 * fVar234 + fVar197 * fVar227 + fVar142 * fVar215
      ;
      fVar248 = local_188 * fVar235 +
                local_398 * fVar228 + local_328 * fVar218 + local_2d8 * fVar128;
      fVar250 = local_188 * fVar236 +
                local_398 * fVar230 + local_328 * fVar223 + local_2d8 * fVar162;
      fVar252 = local_188 * fVar237 +
                local_398 * fVar231 + local_328 * fVar226 + local_2d8 * fVar172;
      fVar257 = local_188 * fVar246 +
                local_398 * fVar234 + local_328 * fVar227 + local_2d8 * fVar215;
      local_178 = fStack_3ac;
      fStack_174 = fStack_3ac;
      fStack_170 = fStack_3ac;
      fStack_16c = fStack_3ac;
      auVar183._0_4_ =
           fStack_3ac * fVar235 + fVar101 * fVar228 + fStack_3bc * fVar218 + fStack_3cc * fVar128;
      auVar183._4_4_ =
           fStack_3ac * fVar236 + fVar101 * fVar230 + fStack_3bc * fVar223 + fStack_3cc * fVar162;
      auVar183._8_4_ =
           fStack_3ac * fVar237 + fVar101 * fVar231 + fStack_3bc * fVar226 + fStack_3cc * fVar172;
      auVar183._12_4_ =
           fStack_3ac * fVar246 + fVar101 * fVar234 + fStack_3bc * fVar227 + fStack_3cc * fVar215;
      local_338 = (float)local_2f8._0_4_ - local_258;
      fStack_334 = (float)local_2f8._4_4_ - fStack_254;
      fStack_330 = fStack_2f0 - fStack_250;
      fStack_32c = fStack_2ec - fStack_24c;
      fVar223 = fVar248 - local_268;
      fVar226 = fVar250 - fStack_264;
      fVar259 = fVar252 - fStack_260;
      fVar261 = fVar257 - fStack_25c;
      fVar128 = local_268 * local_338 - local_258 * fVar223;
      fVar162 = fStack_264 * fStack_334 - fStack_254 * fVar226;
      fVar172 = fStack_260 * fStack_330 - fStack_250 * fVar259;
      fVar218 = fStack_25c * fStack_32c - fStack_24c * fVar261;
      auVar132 = maxps(auVar134,auVar183);
      bVar29 = fVar128 * fVar128 <=
               auVar132._0_4_ * auVar132._0_4_ * (local_338 * local_338 + fVar223 * fVar223) &&
               0.0 < fVar130;
      auVar147._0_4_ = -(uint)bVar29;
      bVar30 = fVar162 * fVar162 <=
               auVar132._4_4_ * auVar132._4_4_ * (fStack_334 * fStack_334 + fVar226 * fVar226) &&
               1.0 < fVar130;
      auVar147._4_4_ = -(uint)bVar30;
      bVar28 = fVar172 * fVar172 <=
               auVar132._8_4_ * auVar132._8_4_ * (fStack_330 * fStack_330 + fVar259 * fVar259) &&
               2.0 < fVar130;
      auVar147._8_4_ = -(uint)bVar28;
      bVar27 = 3.0 < fVar130 &&
               fVar218 * fVar218 <=
               auVar132._12_4_ * auVar132._12_4_ * (fStack_32c * fStack_32c + fVar261 * fVar261);
      auVar147._12_4_ = -(uint)bVar27;
      local_388 = auVar244._0_4_;
      fStack_384 = auVar244._4_4_;
      fStack_380 = auVar244._8_4_;
      fStack_37c = auVar244._12_4_;
      local_388 = local_388 * 4.7683716e-07;
      iVar32 = movmskps(iVar6,auVar147);
      fVar128 = *(float *)(ray + k * 4 + 0x30);
      _local_3a8 = ZEXT416((uint)fVar128);
      fStack_184 = local_188;
      fStack_180 = local_188;
      fStack_17c = local_188;
      fStack_394 = local_398;
      fStack_390 = local_398;
      fStack_38c = local_398;
      fStack_374 = local_378;
      fStack_370 = local_378;
      fStack_36c = local_378;
      fStack_324 = local_328;
      fStack_320 = local_328;
      fStack_31c = local_328;
      fStack_2e4 = local_2e8;
      fStack_2e0 = local_2e8;
      fStack_2dc = local_2e8;
      fStack_2d4 = local_2d8;
      fStack_2d0 = local_2d8;
      fStack_2cc = local_2d8;
      fStack_2c4 = local_2c8;
      fStack_2c0 = local_2c8;
      fStack_2bc = local_2c8;
      if (iVar32 == 0) {
        uVar48 = 0;
      }
      else {
        local_288._0_4_ = auVar14._0_4_;
        local_288._4_4_ = auVar14._4_4_;
        fStack_280 = auVar14._8_4_;
        local_518._0_4_ = auVar13._0_4_;
        local_518._4_4_ = auVar13._4_4_;
        fStack_510 = auVar13._8_4_;
        fVar55 = (float)local_518._0_4_ * fVar129 + (float)local_288._0_4_ * local_2c8 +
                 fVar228 * local_378 + fVar235 * fVar196;
        fVar93 = (float)local_518._4_4_ * fVar129 + (float)local_288._4_4_ * local_2c8 +
                 fVar230 * local_378 + fVar236 * fVar196;
        fVar97 = fStack_510 * fVar129 + fStack_280 * local_2c8 + fVar231 * local_378 +
                 fVar237 * fVar196;
        fVar99 = fVar215 * fVar129 + fVar227 * local_2c8 + fVar234 * local_378 + fVar246 * fVar196;
        local_448 = auVar12._0_4_;
        fStack_444 = auVar12._4_4_;
        fStack_440 = auVar12._8_4_;
        fVar145 = fVar190 * fVar129 + local_448 * local_2c8 + fVar144 * local_378 +
                  local_278 * fVar196;
        fVar158 = fVar174 * fVar129 + fStack_444 * local_2c8 + fVar157 * local_378 +
                  fStack_274 * fVar196;
        fVar160 = fVar188 * fVar129 + fStack_440 * local_2c8 + fVar159 * local_378 +
                  fStack_270 * fVar196;
        fVar161 = fVar189 * fVar129 + fVar173 * local_2c8 + fVar195 * local_378 +
                  fStack_26c * fVar196;
        fVar162 = *(float *)(catmullrom_basis0 + lVar9 + 0x1210);
        fVar172 = *(float *)(catmullrom_basis0 + lVar9 + 0x1214);
        fVar173 = *(float *)(catmullrom_basis0 + lVar9 + 0x1218);
        fVar190 = *(float *)(catmullrom_basis0 + lVar9 + 0x121c);
        fVar174 = *(float *)(catmullrom_basis0 + lVar9 + 0x1694);
        fVar188 = *(float *)(catmullrom_basis0 + lVar9 + 0x1698);
        fVar189 = *(float *)(catmullrom_basis0 + lVar9 + 0x169c);
        fVar144 = *(float *)(catmullrom_basis0 + lVar9 + 0x16a0);
        fVar157 = *(float *)(catmullrom_basis0 + lVar9 + 0x1b18);
        fVar159 = *(float *)(catmullrom_basis0 + lVar9 + 0x1b1c);
        fVar195 = *(float *)(catmullrom_basis0 + lVar9 + 0x1b20);
        fVar215 = *(float *)(catmullrom_basis0 + lVar9 + 0x1b24);
        fVar218 = *(float *)(catmullrom_basis0 + lVar9 + 0x1f9c);
        fVar227 = *(float *)(catmullrom_basis0 + lVar9 + 0x1fa0);
        fVar228 = *(float *)(catmullrom_basis0 + lVar9 + 0x1fa4);
        fVar230 = *(float *)(catmullrom_basis0 + lVar9 + 0x1fa8);
        fVar238 = local_138 * fVar162 + local_2e8 * fVar174 + fVar197 * fVar157 + fVar142 * fVar218;
        fVar247 = local_138 * fVar172 + local_2e8 * fVar188 + fVar197 * fVar159 + fVar142 * fVar227;
        fVar249 = local_138 * fVar173 + local_2e8 * fVar189 + fVar197 * fVar195 + fVar142 * fVar228;
        fVar251 = local_138 * fVar190 + local_2e8 * fVar144 + fVar197 * fVar215 + fVar142 * fVar230;
        fVar275 = local_188 * fVar162 +
                  local_398 * fVar174 + local_328 * fVar157 + local_2d8 * fVar218;
        fVar276 = local_188 * fVar172 +
                  local_398 * fVar188 + local_328 * fVar159 + local_2d8 * fVar227;
        fVar277 = local_188 * fVar173 +
                  local_398 * fVar189 + local_328 * fVar195 + local_2d8 * fVar228;
        fVar278 = local_188 * fVar190 +
                  local_398 * fVar144 + local_328 * fVar215 + local_2d8 * fVar230;
        fVar231 = *(float *)(catmullrom_basis1 + lVar9 + 0x1210);
        fVar234 = *(float *)(catmullrom_basis1 + lVar9 + 0x1214);
        fVar235 = *(float *)(catmullrom_basis1 + lVar9 + 0x1218);
        fVar236 = *(float *)(catmullrom_basis1 + lVar9 + 0x121c);
        fVar237 = *(float *)(catmullrom_basis1 + lVar9 + 0x1b18);
        fVar246 = *(float *)(catmullrom_basis1 + lVar9 + 0x1b1c);
        fVar199 = *(float *)(catmullrom_basis1 + lVar9 + 0x1b20);
        fVar217 = *(float *)(catmullrom_basis1 + lVar9 + 0x1b24);
        fVar220 = *(float *)(catmullrom_basis1 + lVar9 + 0x1f9c);
        fVar222 = *(float *)(catmullrom_basis1 + lVar9 + 0x1fa0);
        fVar232 = *(float *)(catmullrom_basis1 + lVar9 + 0x1fa4);
        fVar233 = *(float *)(catmullrom_basis1 + lVar9 + 0x1fa8);
        fVar253 = *(float *)(catmullrom_basis1 + lVar9 + 0x1694);
        fVar258 = *(float *)(catmullrom_basis1 + lVar9 + 0x1698);
        fVar260 = *(float *)(catmullrom_basis1 + lVar9 + 0x169c);
        fVar262 = *(float *)(catmullrom_basis1 + lVar9 + 0x16a0);
        fVar267 = local_138 * fVar231 + local_2e8 * fVar253 + fVar197 * fVar237 + fVar142 * fVar220;
        fVar270 = local_138 * fVar234 + local_2e8 * fVar258 + fVar197 * fVar246 + fVar142 * fVar222;
        fVar271 = local_138 * fVar235 + local_2e8 * fVar260 + fVar197 * fVar199 + fVar142 * fVar232;
        fVar273 = local_138 * fVar236 + local_2e8 * fVar262 + fVar197 * fVar217 + fVar142 * fVar233;
        fVar198 = local_188 * fVar231 +
                  local_398 * fVar253 + local_328 * fVar237 + local_2d8 * fVar220;
        fVar216 = local_188 * fVar234 +
                  local_398 * fVar258 + local_328 * fVar246 + local_2d8 * fVar222;
        fVar219 = local_188 * fVar235 +
                  local_398 * fVar260 + local_328 * fVar199 + local_2d8 * fVar232;
        fVar221 = local_188 * fVar236 +
                  local_398 * fVar262 + local_328 * fVar217 + local_2d8 * fVar233;
        uVar56 = (uint)DAT_01f7b6c0;
        uVar94 = DAT_01f7b6c0._4_4_;
        uVar98 = DAT_01f7b6c0._8_4_;
        uVar100 = DAT_01f7b6c0._12_4_;
        auVar255._0_4_ = (uint)fVar238 & uVar56;
        auVar255._4_4_ = (uint)fVar247 & uVar94;
        auVar255._8_4_ = (uint)fVar249 & uVar98;
        auVar255._12_4_ = (uint)fVar251 & uVar100;
        auVar225._0_4_ = (uint)fVar275 & uVar56;
        auVar225._4_4_ = (uint)fVar276 & uVar94;
        auVar225._8_4_ = (uint)fVar277 & uVar98;
        auVar225._12_4_ = (uint)fVar278 & uVar100;
        auVar132 = maxps(auVar255,auVar225);
        auVar263._0_4_ =
             (uint)(fVar162 * fVar196 +
                   fVar174 * local_378 + fVar157 * local_2c8 + fVar218 * fVar129) & uVar56;
        auVar263._4_4_ =
             (uint)(fVar172 * fVar196 +
                   fVar188 * local_378 + fVar159 * local_2c8 + fVar227 * fVar129) & uVar94;
        auVar263._8_4_ =
             (uint)(fVar173 * fVar196 +
                   fVar189 * local_378 + fVar195 * local_2c8 + fVar228 * fVar129) & uVar98;
        auVar263._12_4_ =
             (uint)(fVar190 * fVar196 +
                   fVar144 * local_378 + fVar215 * local_2c8 + fVar230 * fVar129) & uVar100;
        auVar132 = maxps(auVar132,auVar263);
        uVar48 = -(uint)(local_388 <= auVar132._0_4_);
        uVar50 = -(uint)(local_388 <= auVar132._4_4_);
        uVar49 = -(uint)(local_388 <= auVar132._8_4_);
        uVar51 = -(uint)(local_388 <= auVar132._12_4_);
        fVar188 = (float)((uint)fVar238 & uVar48 | ~uVar48 & (uint)local_338);
        fVar144 = (float)((uint)fVar247 & uVar50 | ~uVar50 & (uint)fStack_334);
        fVar157 = (float)((uint)fVar249 & uVar49 | ~uVar49 & (uint)fStack_330);
        fVar159 = (float)((uint)fVar251 & uVar51 | ~uVar51 & (uint)fStack_32c);
        fVar195 = (float)(~uVar48 & (uint)fVar223 | (uint)fVar275 & uVar48);
        fVar215 = (float)(~uVar50 & (uint)fVar226 | (uint)fVar276 & uVar50);
        fVar218 = (float)(~uVar49 & (uint)fVar259 | (uint)fVar277 & uVar49);
        fVar227 = (float)(~uVar51 & (uint)fVar261 | (uint)fVar278 & uVar51);
        auVar264._0_4_ = (uint)fVar267 & uVar56;
        auVar264._4_4_ = (uint)fVar270 & uVar94;
        auVar264._8_4_ = (uint)fVar271 & uVar98;
        auVar264._12_4_ = (uint)fVar273 & uVar100;
        auVar229._0_4_ = (uint)fVar198 & uVar56;
        auVar229._4_4_ = (uint)fVar216 & uVar94;
        auVar229._8_4_ = (uint)fVar219 & uVar98;
        auVar229._12_4_ = (uint)fVar221 & uVar100;
        auVar132 = maxps(auVar264,auVar229);
        auVar192._0_4_ =
             (uint)(fVar231 * fVar196 +
                   fVar253 * local_378 + fVar237 * local_2c8 + fVar220 * fVar129) & uVar56;
        auVar192._4_4_ =
             (uint)(fVar234 * fVar196 +
                   fVar258 * local_378 + fVar246 * local_2c8 + fVar222 * fVar129) & uVar94;
        auVar192._8_4_ =
             (uint)(fVar235 * fVar196 +
                   fVar260 * local_378 + fVar199 * local_2c8 + fVar232 * fVar129) & uVar98;
        auVar192._12_4_ =
             (uint)(fVar236 * fVar196 +
                   fVar262 * local_378 + fVar217 * local_2c8 + fVar233 * fVar129) & uVar100;
        auVar132 = maxps(auVar132,auVar192);
        uVar48 = -(uint)(local_388 <= auVar132._0_4_);
        uVar50 = -(uint)(local_388 <= auVar132._4_4_);
        uVar49 = -(uint)(local_388 <= auVar132._8_4_);
        uVar51 = -(uint)(local_388 <= auVar132._12_4_);
        fVar231 = (float)((uint)fVar267 & uVar48 | ~uVar48 & (uint)local_338);
        fVar234 = (float)((uint)fVar270 & uVar50 | ~uVar50 & (uint)fStack_334);
        fVar235 = (float)((uint)fVar271 & uVar49 | ~uVar49 & (uint)fStack_330);
        fVar237 = (float)((uint)fVar273 & uVar51 | ~uVar51 & (uint)fStack_32c);
        fVar223 = (float)(~uVar48 & (uint)fVar223 | (uint)fVar198 & uVar48);
        fVar226 = (float)(~uVar50 & (uint)fVar226 | (uint)fVar216 & uVar50);
        fVar228 = (float)(~uVar49 & (uint)fVar259 | (uint)fVar219 & uVar49);
        fVar230 = (float)(~uVar51 & (uint)fVar261 | (uint)fVar221 & uVar51);
        auVar109._0_4_ = fVar195 * fVar195 + fVar188 * fVar188;
        auVar109._4_4_ = fVar215 * fVar215 + fVar144 * fVar144;
        auVar109._8_4_ = fVar218 * fVar218 + fVar157 * fVar157;
        auVar109._12_4_ = fVar227 * fVar227 + fVar159 * fVar159;
        auVar132 = rsqrtps(_DAT_01f7b6c0,auVar109);
        fVar162 = auVar132._0_4_;
        fVar172 = auVar132._4_4_;
        fVar173 = auVar132._8_4_;
        fVar190 = auVar132._12_4_;
        auVar166._0_4_ = fVar162 * fVar162 * auVar109._0_4_ * 0.5 * fVar162;
        auVar166._4_4_ = fVar172 * fVar172 * auVar109._4_4_ * 0.5 * fVar172;
        auVar166._8_4_ = fVar173 * fVar173 * auVar109._8_4_ * 0.5 * fVar173;
        auVar166._12_4_ = fVar190 * fVar190 * auVar109._12_4_ * 0.5 * fVar190;
        fVar236 = fVar162 * 1.5 - auVar166._0_4_;
        fVar246 = fVar172 * 1.5 - auVar166._4_4_;
        fVar259 = fVar173 * 1.5 - auVar166._8_4_;
        fVar261 = fVar190 * 1.5 - auVar166._12_4_;
        auVar110._0_4_ = fVar223 * fVar223 + fVar231 * fVar231;
        auVar110._4_4_ = fVar226 * fVar226 + fVar234 * fVar234;
        auVar110._8_4_ = fVar228 * fVar228 + fVar235 * fVar235;
        auVar110._12_4_ = fVar230 * fVar230 + fVar237 * fVar237;
        auVar132 = rsqrtps(auVar166,auVar110);
        fVar162 = auVar132._0_4_;
        fVar172 = auVar132._4_4_;
        fVar173 = auVar132._8_4_;
        fVar190 = auVar132._12_4_;
        fVar162 = fVar162 * 1.5 - fVar162 * fVar162 * auVar110._0_4_ * 0.5 * fVar162;
        fVar174 = fVar172 * 1.5 - fVar172 * fVar172 * auVar110._4_4_ * 0.5 * fVar172;
        fVar173 = fVar173 * 1.5 - fVar173 * fVar173 * auVar110._8_4_ * 0.5 * fVar173;
        fVar189 = fVar190 * 1.5 - fVar190 * fVar190 * auVar110._12_4_ * 0.5 * fVar190;
        fVar253 = fVar195 * fVar236 * auVar134._0_4_;
        fVar258 = fVar215 * fVar246 * auVar134._4_4_;
        fVar260 = fVar218 * fVar259 * auVar134._8_4_;
        fVar262 = fVar227 * fVar261 * auVar134._12_4_;
        fVar172 = -fVar188 * fVar236 * auVar134._0_4_;
        fVar190 = -fVar144 * fVar246 * auVar134._4_4_;
        fVar188 = -fVar157 * fVar259 * auVar134._8_4_;
        fVar144 = -fVar159 * fVar261 * auVar134._12_4_;
        fVar267 = fVar236 * 0.0 * auVar134._0_4_;
        fVar270 = fVar246 * 0.0 * auVar134._4_4_;
        fVar271 = fVar259 * 0.0 * auVar134._8_4_;
        fVar273 = fVar261 * 0.0 * auVar134._12_4_;
        fVar198 = fVar223 * fVar162 * auVar183._0_4_;
        fVar216 = fVar226 * fVar174 * auVar183._4_4_;
        fVar249 = fVar228 * fVar173 * auVar183._8_4_;
        fVar251 = fVar230 * fVar189 * auVar183._12_4_;
        fVar157 = (float)local_2f8._0_4_ + fVar198;
        fVar159 = (float)local_2f8._4_4_ + fVar216;
        fVar195 = fStack_2f0 + fVar249;
        fVar215 = fStack_2ec + fVar251;
        fVar236 = -fVar231 * fVar162 * auVar183._0_4_;
        fVar246 = -fVar234 * fVar174 * auVar183._4_4_;
        fVar232 = -fVar235 * fVar173 * auVar183._8_4_;
        fVar233 = -fVar237 * fVar189 * auVar183._12_4_;
        fVar199 = fVar248 + fVar236;
        fVar217 = fVar250 + fVar246;
        fVar220 = fVar252 + fVar232;
        fVar222 = fVar257 + fVar233;
        fVar223 = fVar162 * 0.0 * auVar183._0_4_;
        fVar227 = fVar174 * 0.0 * auVar183._4_4_;
        fVar230 = fVar173 * 0.0 * auVar183._8_4_;
        fVar234 = fVar189 * 0.0 * auVar183._12_4_;
        fVar235 = local_258 - fVar253;
        fVar237 = fStack_254 - fVar258;
        fVar259 = fStack_250 - fVar260;
        fVar261 = fStack_24c - fVar262;
        fVar219 = fVar55 + fVar223;
        fVar221 = fVar93 + fVar227;
        fVar238 = fVar97 + fVar230;
        fVar247 = fVar99 + fVar234;
        fVar162 = local_268 - fVar172;
        fVar173 = fStack_264 - fVar190;
        fVar174 = fStack_260 - fVar188;
        fVar189 = fStack_25c - fVar144;
        fVar218 = fVar145 - fVar267;
        fVar226 = fVar158 - fVar270;
        fVar228 = fVar160 - fVar271;
        fVar231 = fVar161 - fVar273;
        uVar48 = -(uint)(0.0 < (fVar162 * (fVar219 - fVar218) - fVar218 * (fVar199 - fVar162)) * 0.0
                               + (fVar218 * (fVar157 - fVar235) - (fVar219 - fVar218) * fVar235) *
                                 0.0 + ((fVar199 - fVar162) * fVar235 -
                                       (fVar157 - fVar235) * fVar162));
        uVar50 = -(uint)(0.0 < (fVar173 * (fVar221 - fVar226) - fVar226 * (fVar217 - fVar173)) * 0.0
                               + (fVar226 * (fVar159 - fVar237) - (fVar221 - fVar226) * fVar237) *
                                 0.0 + ((fVar217 - fVar173) * fVar237 -
                                       (fVar159 - fVar237) * fVar173));
        uVar49 = -(uint)(0.0 < (fVar174 * (fVar238 - fVar228) - fVar228 * (fVar220 - fVar174)) * 0.0
                               + (fVar228 * (fVar195 - fVar259) - (fVar238 - fVar228) * fVar259) *
                                 0.0 + ((fVar220 - fVar174) * fVar259 -
                                       (fVar195 - fVar259) * fVar174));
        uVar51 = -(uint)(0.0 < (fVar189 * (fVar247 - fVar231) - fVar231 * (fVar222 - fVar189)) * 0.0
                               + (fVar231 * (fVar215 - fVar261) - (fVar247 - fVar231) * fVar261) *
                                 0.0 + ((fVar222 - fVar189) * fVar261 -
                                       (fVar215 - fVar261) * fVar189));
        fVar253 = (float)((uint)((float)local_2f8._0_4_ - fVar198) & uVar48 |
                         ~uVar48 & (uint)(local_258 + fVar253));
        fVar258 = (float)((uint)((float)local_2f8._4_4_ - fVar216) & uVar50 |
                         ~uVar50 & (uint)(fStack_254 + fVar258));
        fVar260 = (float)((uint)(fStack_2f0 - fVar249) & uVar49 |
                         ~uVar49 & (uint)(fStack_250 + fVar260));
        fVar262 = (float)((uint)(fStack_2ec - fVar251) & uVar51 |
                         ~uVar51 & (uint)(fStack_24c + fVar262));
        fVar198 = (float)((uint)(fVar248 - fVar236) & uVar48 | ~uVar48 & (uint)(local_268 + fVar172)
                         );
        fVar216 = (float)((uint)(fVar250 - fVar246) & uVar50 |
                         ~uVar50 & (uint)(fStack_264 + fVar190));
        fVar232 = (float)((uint)(fVar252 - fVar232) & uVar49 |
                         ~uVar49 & (uint)(fStack_260 + fVar188));
        fVar233 = (float)((uint)(fVar257 - fVar233) & uVar51 |
                         ~uVar51 & (uint)(fStack_25c + fVar144));
        fVar145 = (float)((uint)(fVar55 - fVar223) & uVar48 | ~uVar48 & (uint)(fVar145 + fVar267));
        fVar158 = (float)((uint)(fVar93 - fVar227) & uVar50 | ~uVar50 & (uint)(fVar158 + fVar270));
        fVar97 = (float)((uint)(fVar97 - fVar230) & uVar49 | ~uVar49 & (uint)(fVar160 + fVar271));
        fVar99 = (float)((uint)(fVar99 - fVar234) & uVar51 | ~uVar51 & (uint)(fVar161 + fVar273));
        fVar236 = (float)((uint)fVar235 & uVar48 | ~uVar48 & (uint)fVar157);
        fVar246 = (float)((uint)fVar237 & uVar50 | ~uVar50 & (uint)fVar159);
        fVar248 = (float)((uint)fVar259 & uVar49 | ~uVar49 & (uint)fVar195);
        fVar250 = (float)((uint)fVar261 & uVar51 | ~uVar51 & (uint)fVar215);
        fVar172 = (float)((uint)fVar162 & uVar48 | ~uVar48 & (uint)fVar199);
        fVar190 = (float)((uint)fVar173 & uVar50 | ~uVar50 & (uint)fVar217);
        fVar188 = (float)((uint)fVar174 & uVar49 | ~uVar49 & (uint)fVar220);
        fVar144 = (float)((uint)fVar189 & uVar51 | ~uVar51 & (uint)fVar222);
        fVar223 = (float)((uint)fVar218 & uVar48 | ~uVar48 & (uint)fVar219);
        fVar227 = (float)((uint)fVar226 & uVar50 | ~uVar50 & (uint)fVar221);
        fVar230 = (float)((uint)fVar228 & uVar49 | ~uVar49 & (uint)fVar238);
        fVar234 = (float)((uint)fVar231 & uVar51 | ~uVar51 & (uint)fVar247);
        fVar157 = (float)((uint)fVar157 & uVar48 | ~uVar48 & (uint)fVar235) - fVar253;
        fVar159 = (float)((uint)fVar159 & uVar50 | ~uVar50 & (uint)fVar237) - fVar258;
        fVar195 = (float)((uint)fVar195 & uVar49 | ~uVar49 & (uint)fVar259) - fVar260;
        fVar215 = (float)((uint)fVar215 & uVar51 | ~uVar51 & (uint)fVar261) - fVar262;
        fVar235 = (float)((uint)fVar199 & uVar48 | ~uVar48 & (uint)fVar162) - fVar198;
        fVar237 = (float)((uint)fVar217 & uVar50 | ~uVar50 & (uint)fVar173) - fVar216;
        fVar252 = (float)((uint)fVar220 & uVar49 | ~uVar49 & (uint)fVar174) - fVar232;
        fVar257 = (float)((uint)fVar222 & uVar51 | ~uVar51 & (uint)fVar189) - fVar233;
        fVar259 = (float)((uint)fVar219 & uVar48 | ~uVar48 & (uint)fVar218) - fVar145;
        fVar261 = (float)((uint)fVar221 & uVar50 | ~uVar50 & (uint)fVar226) - fVar158;
        fVar199 = (float)((uint)fVar238 & uVar49 | ~uVar49 & (uint)fVar228) - fVar97;
        fVar217 = (float)((uint)fVar247 & uVar51 | ~uVar51 & (uint)fVar231) - fVar99;
        fVar160 = fVar253 - fVar236;
        fVar161 = fVar258 - fVar246;
        fVar219 = fVar260 - fVar248;
        fVar221 = fVar262 - fVar250;
        fVar218 = fVar198 - fVar172;
        fVar226 = fVar216 - fVar190;
        fVar228 = fVar232 - fVar188;
        fVar231 = fVar233 - fVar144;
        fVar162 = fVar145 - fVar223;
        fVar173 = fVar158 - fVar227;
        fVar174 = fVar97 - fVar230;
        fVar189 = fVar99 - fVar234;
        fVar220 = (fVar198 * fVar259 - fVar145 * fVar235) * 0.0 +
                  (fVar145 * fVar157 - fVar253 * fVar259) * 0.0 +
                  (fVar253 * fVar235 - fVar198 * fVar157);
        fVar222 = (fVar216 * fVar261 - fVar158 * fVar237) * 0.0 +
                  (fVar158 * fVar159 - fVar258 * fVar261) * 0.0 +
                  (fVar258 * fVar237 - fVar216 * fVar159);
        auVar148._4_4_ = fVar222;
        auVar148._0_4_ = fVar220;
        fVar55 = (fVar232 * fVar199 - fVar97 * fVar252) * 0.0 +
                 (fVar97 * fVar195 - fVar260 * fVar199) * 0.0 +
                 (fVar260 * fVar252 - fVar232 * fVar195);
        fVar93 = (fVar233 * fVar217 - fVar99 * fVar257) * 0.0 +
                 (fVar99 * fVar215 - fVar262 * fVar217) * 0.0 +
                 (fVar262 * fVar257 - fVar233 * fVar215);
        auVar268._0_4_ =
             (fVar172 * fVar162 - fVar223 * fVar218) * 0.0 +
             (fVar223 * fVar160 - fVar236 * fVar162) * 0.0 + (fVar236 * fVar218 - fVar172 * fVar160)
        ;
        auVar268._4_4_ =
             (fVar190 * fVar173 - fVar227 * fVar226) * 0.0 +
             (fVar227 * fVar161 - fVar246 * fVar173) * 0.0 + (fVar246 * fVar226 - fVar190 * fVar161)
        ;
        auVar268._8_4_ =
             (fVar188 * fVar174 - fVar230 * fVar228) * 0.0 +
             (fVar230 * fVar219 - fVar248 * fVar174) * 0.0 + (fVar248 * fVar228 - fVar188 * fVar219)
        ;
        auVar268._12_4_ =
             (fVar144 * fVar189 - fVar234 * fVar231) * 0.0 +
             (fVar234 * fVar221 - fVar250 * fVar189) * 0.0 + (fVar250 * fVar231 - fVar144 * fVar221)
        ;
        auVar148._8_4_ = fVar55;
        auVar148._12_4_ = fVar93;
        auVar132 = maxps(auVar148,auVar268);
        bVar29 = auVar132._0_4_ <= 0.0 && bVar29;
        auVar149._0_4_ = -(uint)bVar29;
        bVar30 = auVar132._4_4_ <= 0.0 && bVar30;
        auVar149._4_4_ = -(uint)bVar30;
        bVar28 = auVar132._8_4_ <= 0.0 && bVar28;
        auVar149._8_4_ = -(uint)bVar28;
        bVar27 = auVar132._12_4_ <= 0.0 && bVar27;
        auVar149._12_4_ = -(uint)bVar27;
        iVar32 = movmskps(iVar32,auVar149);
        if (iVar32 == 0) {
LAB_00a88a5d:
          auVar150._8_8_ = uStack_3e0;
          auVar150._0_8_ = local_3e8;
        }
        else {
          auVar167._0_4_ = fVar162 * fVar235;
          auVar167._4_4_ = fVar173 * fVar237;
          auVar167._8_4_ = fVar174 * fVar252;
          auVar167._12_4_ = fVar189 * fVar257;
          fVar223 = fVar218 * fVar259 - auVar167._0_4_;
          fVar227 = fVar226 * fVar261 - auVar167._4_4_;
          fVar230 = fVar228 * fVar199 - auVar167._8_4_;
          fVar234 = fVar231 * fVar217 - auVar167._12_4_;
          fVar162 = fVar162 * fVar157 - fVar259 * fVar160;
          fVar173 = fVar173 * fVar159 - fVar261 * fVar161;
          fVar174 = fVar174 * fVar195 - fVar199 * fVar219;
          fVar189 = fVar189 * fVar215 - fVar217 * fVar221;
          fVar157 = fVar160 * fVar235 - fVar218 * fVar157;
          fVar159 = fVar161 * fVar237 - fVar226 * fVar159;
          fVar195 = fVar219 * fVar252 - fVar228 * fVar195;
          fVar215 = fVar221 * fVar257 - fVar231 * fVar215;
          auVar184._0_4_ = fVar223 * 0.0 + fVar162 * 0.0 + fVar157;
          auVar184._4_4_ = fVar227 * 0.0 + fVar173 * 0.0 + fVar159;
          auVar184._8_4_ = fVar230 * 0.0 + fVar174 * 0.0 + fVar195;
          auVar184._12_4_ = fVar234 * 0.0 + fVar189 * 0.0 + fVar215;
          auVar132 = rcpps(auVar167,auVar184);
          fVar172 = auVar132._0_4_;
          fVar190 = auVar132._4_4_;
          fVar188 = auVar132._8_4_;
          fVar144 = auVar132._12_4_;
          fVar172 = (1.0 - auVar184._0_4_ * fVar172) * fVar172 + fVar172;
          fVar190 = (1.0 - auVar184._4_4_ * fVar190) * fVar190 + fVar190;
          fVar188 = (1.0 - auVar184._8_4_ * fVar188) * fVar188 + fVar188;
          fVar144 = (1.0 - auVar184._12_4_ * fVar144) * fVar144 + fVar144;
          fVar157 = (fVar145 * fVar157 + fVar198 * fVar162 + fVar253 * fVar223) * fVar172;
          fVar173 = (fVar158 * fVar159 + fVar216 * fVar173 + fVar258 * fVar227) * fVar190;
          auVar193._4_4_ = fVar173;
          auVar193._0_4_ = fVar157;
          fVar174 = (fVar97 * fVar195 + fVar232 * fVar174 + fVar260 * fVar230) * fVar188;
          fVar189 = (fVar99 * fVar215 + fVar233 * fVar189 + fVar262 * fVar234) * fVar144;
          fVar162 = *(float *)(ray + k * 4 + 0x80);
          bVar29 = (fVar157 <= fVar162 && fVar128 <= fVar157) && bVar29;
          auVar80._0_4_ = -(uint)bVar29;
          bVar30 = (fVar173 <= fVar162 && fVar128 <= fVar173) && bVar30;
          auVar80._4_4_ = -(uint)bVar30;
          bVar28 = (fVar174 <= fVar162 && fVar128 <= fVar174) && bVar28;
          auVar80._8_4_ = -(uint)bVar28;
          bVar27 = (fVar189 <= fVar162 && fVar128 <= fVar189) && bVar27;
          auVar80._12_4_ = -(uint)bVar27;
          iVar32 = movmskps(iVar32,auVar80);
          if (iVar32 == 0) goto LAB_00a88a5d;
          auVar81._0_8_ =
               CONCAT44(-(uint)(auVar184._4_4_ != 0.0 && bVar30),
                        -(uint)(auVar184._0_4_ != 0.0 && bVar29));
          auVar81._8_4_ = -(uint)(auVar184._8_4_ != 0.0 && bVar28);
          auVar81._12_4_ = -(uint)(auVar184._12_4_ != 0.0 && bVar27);
          iVar32 = movmskps(iVar32,auVar81);
          auVar150._8_8_ = uStack_3e0;
          auVar150._0_8_ = local_3e8;
          if (iVar32 != 0) {
            fVar220 = fVar220 * fVar172;
            fVar222 = fVar222 * fVar190;
            fVar55 = fVar55 * fVar188;
            fVar93 = fVar93 * fVar144;
            fVar143 = (float)((uint)(1.0 - fVar220) & uVar48 | ~uVar48 & (uint)fVar220);
            fVar53 = (float)((uint)(1.0 - fVar222) & uVar50 | ~uVar50 & (uint)fVar222);
            fVar54 = (float)((uint)(1.0 - fVar55) & uVar49 | ~uVar49 & (uint)fVar55);
            fVar91 = (float)((uint)(1.0 - fVar93) & uVar51 | ~uVar51 & (uint)fVar93);
            local_298 = (float)(~uVar48 & (uint)(auVar268._0_4_ * fVar172) |
                               (uint)(1.0 - auVar268._0_4_ * fVar172) & uVar48);
            fStack_294 = (float)(~uVar50 & (uint)(auVar268._4_4_ * fVar190) |
                                (uint)(1.0 - auVar268._4_4_ * fVar190) & uVar50);
            fStack_290 = (float)(~uVar49 & (uint)(auVar268._8_4_ * fVar188) |
                                (uint)(1.0 - auVar268._8_4_ * fVar188) & uVar49);
            fStack_28c = (float)(~uVar51 & (uint)(auVar268._12_4_ * fVar144) |
                                (uint)(1.0 - auVar268._12_4_ * fVar144) & uVar51);
            auVar150._8_4_ = auVar81._8_4_;
            auVar150._0_8_ = auVar81._0_8_;
            auVar150._12_4_ = auVar81._12_4_;
            auVar193._8_4_ = fVar174;
            auVar193._12_4_ = fVar189;
            auVar66 = auVar193;
          }
        }
        uVar48 = movmskps(iVar32,auVar150);
        if (uVar48 != 0) {
          fVar172 = (auVar183._0_4_ - auVar134._0_4_) * fVar143 + auVar134._0_4_;
          fVar173 = (auVar183._4_4_ - auVar134._4_4_) * fVar53 + auVar134._4_4_;
          fVar190 = (auVar183._8_4_ - auVar134._8_4_) * fVar54 + auVar134._8_4_;
          fVar174 = (auVar183._12_4_ - auVar134._12_4_) * fVar91 + auVar134._12_4_;
          fVar162 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          fVar188 = auVar66._0_4_;
          fVar189 = auVar66._4_4_;
          fVar144 = auVar66._8_4_;
          fVar157 = auVar66._12_4_;
          local_428._0_4_ = -(uint)(fVar162 * (fVar172 + fVar172) < fVar188) & auVar150._0_4_;
          local_428._4_4_ = -(uint)(fVar162 * (fVar173 + fVar173) < fVar189) & auVar150._4_4_;
          local_428._8_4_ = -(uint)(fVar162 * (fVar190 + fVar190) < fVar144) & auVar150._8_4_;
          local_428._12_4_ = -(uint)(fVar162 * (fVar174 + fVar174) < fVar157) & auVar150._12_4_;
          uVar48 = movmskps(uVar48,local_428);
          if (uVar48 != 0) {
            local_298 = local_298 + local_298 + -1.0;
            fStack_294 = fStack_294 + fStack_294 + -1.0;
            fStack_290 = fStack_290 + fStack_290 + -1.0;
            fStack_28c = fStack_28c + fStack_28c + -1.0;
            local_218 = 0;
            uVar48 = *(uint *)(ray + k * 4 + 0x90);
            if ((pGVar7->mask & uVar48) != 0) {
              fVar130 = 1.0 / fVar130;
              local_1b8[0] = fVar130 * (fVar143 + 0.0);
              local_1b8[1] = fVar130 * (fVar53 + 1.0);
              local_1b8[2] = fVar130 * (fVar54 + 2.0);
              local_1b8[3] = fVar130 * (fVar91 + 3.0);
              local_1a8 = CONCAT44(fStack_294,local_298);
              uStack_1a0 = CONCAT44(fStack_28c,fStack_290);
              _local_198 = auVar66;
              auVar111._0_4_ = local_428._0_4_ & (uint)fVar188;
              auVar111._4_4_ = local_428._4_4_ & (uint)fVar189;
              auVar111._8_4_ = local_428._8_4_ & (uint)fVar144;
              auVar111._12_4_ = local_428._12_4_ & (uint)fVar157;
              auVar135._0_8_ = CONCAT44(~local_428._4_4_,~local_428._0_4_) & 0x7f8000007f800000;
              auVar135._8_4_ = ~local_428._8_4_ & 0x7f800000;
              auVar135._12_4_ = ~local_428._12_4_ & 0x7f800000;
              auVar135 = auVar135 | auVar111;
              auVar151._4_4_ = auVar135._0_4_;
              auVar151._0_4_ = auVar135._4_4_;
              auVar151._8_4_ = auVar135._12_4_;
              auVar151._12_4_ = auVar135._8_4_;
              auVar132 = minps(auVar151,auVar135);
              auVar112._0_8_ = auVar132._8_8_;
              auVar112._8_4_ = auVar132._0_4_;
              auVar112._12_4_ = auVar132._4_4_;
              auVar132 = minps(auVar112,auVar132);
              auVar113._0_8_ =
                   CONCAT44(-(uint)(auVar132._4_4_ == auVar135._4_4_) & local_428._4_4_,
                            -(uint)(auVar132._0_4_ == auVar135._0_4_) & local_428._0_4_);
              auVar113._8_4_ = -(uint)(auVar132._8_4_ == auVar135._8_4_) & local_428._8_4_;
              auVar113._12_4_ = -(uint)(auVar132._12_4_ == auVar135._12_4_) & local_428._12_4_;
              iVar32 = movmskps(uVar48,auVar113);
              auVar82 = local_428;
              if (iVar32 != 0) {
                auVar82._8_4_ = auVar113._8_4_;
                auVar82._0_8_ = auVar113._0_8_;
                auVar82._12_4_ = auVar113._12_4_;
              }
              uVar48 = movmskps(iVar32,auVar82);
              lVar41 = 0;
              if (uVar48 != 0) {
                for (; (uVar48 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar128 = local_1b8[lVar41];
                fVar130 = 1.0 - fVar128;
                fVar172 = fVar128 * 3.0;
                fVar173 = ((fVar172 + 2.0) * (fVar130 + fVar130) + fVar130 * -3.0 * fVar130) * 0.5;
                fVar162 = (fVar130 * -2.0 * fVar128 + fVar128 * fVar128) * 0.5;
                fVar172 = (fVar128 * fVar172 + (fVar172 + -5.0) * (fVar128 + fVar128)) * 0.5;
                uVar34 = *(undefined4 *)((long)&local_1a8 + lVar41 * 4);
                fVar130 = (fVar128 * (fVar130 + fVar130) - fVar130 * fVar130) * 0.5;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_198 + lVar41 * 4);
                *(float *)(ray + k * 4 + 0xc0) =
                     fVar130 * local_3b8 +
                     fVar172 * fVar92 + fVar173 * local_3c8 + fVar162 * local_3d8;
                *(float *)(ray + k * 4 + 0xd0) =
                     fVar130 * fStack_3b4 +
                     fVar172 * fVar95 + fVar173 * fStack_3c4 + fVar162 * fStack_3d4;
                *(float *)(ray + k * 4 + 0xe0) =
                     fVar130 * fStack_3b0 +
                     fVar172 * fVar96 + fVar173 * fStack_3c0 + fVar162 * fStack_3d0;
                *(float *)(ray + k * 4 + 0xf0) = fVar128;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar34;
                *(uint *)(ray + k * 4 + 0x110) = uVar47;
                *(uint *)(ray + k * 4 + 0x120) = uVar46;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar48 = context->user->instPrimID[0];
                *(uint *)(ray + k * 4 + 0x140) = uVar48;
              }
              else {
                local_4d8 = CONCAT44(uVar47,uVar47);
                uStack_4d0._0_4_ = uVar47;
                uStack_4d0._4_4_ = uVar47;
                auVar132 = *local_318;
                _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                _local_288 = *pauVar4;
                local_248 = fVar143;
                fStack_244 = fVar53;
                fStack_240 = fVar54;
                fStack_23c = fVar91;
                local_238 = local_298;
                fStack_234 = fStack_294;
                fStack_230 = fStack_290;
                fStack_22c = fStack_28c;
                _local_228 = auVar66;
                local_214 = iVar6;
                local_1f8 = fVar92;
                fStack_1f4 = fVar95;
                fStack_1f0 = fVar96;
                fStack_1ec = fVar101;
                local_1c8 = local_428;
                while( true ) {
                  local_f8 = local_1b8[lVar41];
                  local_e8 = *(undefined4 *)((long)&local_1a8 + lVar41 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_198 + lVar41 * 4);
                  fVar173 = 1.0 - local_f8;
                  fVar128 = local_f8 * 3.0;
                  fVar172 = ((fVar128 + 2.0) * (fVar173 + fVar173) + fVar173 * -3.0 * fVar173) * 0.5
                  ;
                  fVar130 = (local_f8 * local_f8 + fVar173 * -2.0 * local_f8) * 0.5;
                  fVar162 = (local_f8 * fVar128 + (fVar128 + -5.0) * (local_f8 + local_f8)) * 0.5;
                  local_368.context = context->user;
                  fVar128 = (local_f8 * (fVar173 + fVar173) - fVar173 * fVar173) * 0.5;
                  local_128 = fVar128 * local_3b8 +
                              fVar162 * fVar92 + fVar172 * local_3c8 + fVar130 * local_3d8;
                  local_118 = fVar128 * fStack_3b4 +
                              fVar162 * fVar95 + fVar172 * fStack_3c4 + fVar130 * fStack_3d4;
                  local_108 = fVar128 * fStack_3b0 +
                              fVar162 * fVar96 + fVar172 * fStack_3c0 + fVar130 * fStack_3d0;
                  fStack_124 = local_128;
                  fStack_120 = local_128;
                  fStack_11c = local_128;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  uStack_e4 = local_e8;
                  uStack_e0 = local_e8;
                  uStack_dc = local_e8;
                  local_d8 = local_4d8;
                  uStack_d0 = uStack_4d0;
                  local_c8 = CONCAT44(uVar46,uVar46);
                  uStack_c0 = CONCAT44(uVar46,uVar46);
                  local_b8 = (local_368.context)->instID[0];
                  uStack_b4 = local_b8;
                  uStack_b0 = local_b8;
                  uStack_ac = local_b8;
                  local_a8 = (local_368.context)->instPrimID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_368.valid = (int *)local_418;
                  local_368.geometryUserPtr = pGVar7->userPtr;
                  local_368.hit = (RTCHitN *)&local_128;
                  local_368.N = 4;
                  p_Var37 = pGVar7->intersectionFilterN;
                  auVar279._8_8_ = pGVar40;
                  auVar279._0_8_ = p_Var37;
                  local_418 = auVar132;
                  local_368.ray = (RTCRayN *)ray;
                  if (p_Var37 != (RTCFilterFunctionN)0x0) {
                    auVar279 = (*p_Var37)(&local_368);
                    ray = local_310;
                  }
                  pGVar40 = auVar279._8_8_;
                  auVar123._0_4_ = -(uint)(local_418._0_4_ == 0);
                  auVar123._4_4_ = -(uint)(local_418._4_4_ == 0);
                  auVar123._8_4_ = -(uint)(local_418._8_4_ == 0);
                  auVar123._12_4_ = -(uint)(local_418._12_4_ == 0);
                  uVar48 = movmskps(auVar279._0_4_,auVar123);
                  pRVar38 = (RayHitK<4> *)(ulong)(uVar48 ^ 0xf);
                  if ((uVar48 ^ 0xf) == 0) {
                    auVar123 = auVar123 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var37 = context->args->filter;
                    auVar31._8_8_ = pGVar40;
                    auVar31._0_8_ = p_Var37;
                    auVar280._8_8_ = pGVar40;
                    auVar280._0_8_ = p_Var37;
                    if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (auVar280 = auVar31, ((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar280 = (*p_Var37)(&local_368);
                      ray = local_310;
                    }
                    pGVar40 = auVar280._8_8_;
                    auVar87._0_4_ = -(uint)(local_418._0_4_ == 0);
                    auVar87._4_4_ = -(uint)(local_418._4_4_ == 0);
                    auVar87._8_4_ = -(uint)(local_418._8_4_ == 0);
                    auVar87._12_4_ = -(uint)(local_418._12_4_ == 0);
                    auVar123 = auVar87 ^ _DAT_01f7ae20;
                    uVar48 = movmskps(auVar280._0_4_,auVar87);
                    pRVar38 = (RayHitK<4> *)(ulong)(uVar48 ^ 0xf);
                    if ((uVar48 ^ 0xf) != 0) {
                      fVar128 = *(float *)(local_368.hit + 4);
                      fVar130 = *(float *)(local_368.hit + 8);
                      fVar162 = *(float *)(local_368.hit + 0xc);
                      *(uint *)(local_368.ray + 0xc0) =
                           ~auVar87._0_4_ & (uint)*(float *)local_368.hit |
                           *(uint *)(local_368.ray + 0xc0) & auVar87._0_4_;
                      *(uint *)(local_368.ray + 0xc4) =
                           ~auVar87._4_4_ & (uint)fVar128 |
                           *(uint *)(local_368.ray + 0xc4) & auVar87._4_4_;
                      *(uint *)(local_368.ray + 200) =
                           ~auVar87._8_4_ & (uint)fVar130 |
                           *(uint *)(local_368.ray + 200) & auVar87._8_4_;
                      *(uint *)(local_368.ray + 0xcc) =
                           ~auVar87._12_4_ & (uint)fVar162 |
                           *(uint *)(local_368.ray + 0xcc) & auVar87._12_4_;
                      fVar128 = *(float *)(local_368.hit + 0x14);
                      fVar130 = *(float *)(local_368.hit + 0x18);
                      fVar162 = *(float *)(local_368.hit + 0x1c);
                      *(uint *)(local_368.ray + 0xd0) =
                           ~auVar87._0_4_ & (uint)*(float *)(local_368.hit + 0x10) |
                           *(uint *)(local_368.ray + 0xd0) & auVar87._0_4_;
                      *(uint *)(local_368.ray + 0xd4) =
                           ~auVar87._4_4_ & (uint)fVar128 |
                           *(uint *)(local_368.ray + 0xd4) & auVar87._4_4_;
                      *(uint *)(local_368.ray + 0xd8) =
                           ~auVar87._8_4_ & (uint)fVar130 |
                           *(uint *)(local_368.ray + 0xd8) & auVar87._8_4_;
                      *(uint *)(local_368.ray + 0xdc) =
                           ~auVar87._12_4_ & (uint)fVar162 |
                           *(uint *)(local_368.ray + 0xdc) & auVar87._12_4_;
                      fVar128 = *(float *)(local_368.hit + 0x24);
                      fVar130 = *(float *)(local_368.hit + 0x28);
                      fVar162 = *(float *)(local_368.hit + 0x2c);
                      *(uint *)(local_368.ray + 0xe0) =
                           ~auVar87._0_4_ & (uint)*(float *)(local_368.hit + 0x20) |
                           *(uint *)(local_368.ray + 0xe0) & auVar87._0_4_;
                      *(uint *)(local_368.ray + 0xe4) =
                           ~auVar87._4_4_ & (uint)fVar128 |
                           *(uint *)(local_368.ray + 0xe4) & auVar87._4_4_;
                      *(uint *)(local_368.ray + 0xe8) =
                           ~auVar87._8_4_ & (uint)fVar130 |
                           *(uint *)(local_368.ray + 0xe8) & auVar87._8_4_;
                      *(uint *)(local_368.ray + 0xec) =
                           ~auVar87._12_4_ & (uint)fVar162 |
                           *(uint *)(local_368.ray + 0xec) & auVar87._12_4_;
                      fVar128 = *(float *)(local_368.hit + 0x34);
                      fVar130 = *(float *)(local_368.hit + 0x38);
                      fVar162 = *(float *)(local_368.hit + 0x3c);
                      *(uint *)(local_368.ray + 0xf0) =
                           ~auVar87._0_4_ & (uint)*(float *)(local_368.hit + 0x30) |
                           *(uint *)(local_368.ray + 0xf0) & auVar87._0_4_;
                      *(uint *)(local_368.ray + 0xf4) =
                           ~auVar87._4_4_ & (uint)fVar128 |
                           *(uint *)(local_368.ray + 0xf4) & auVar87._4_4_;
                      *(uint *)(local_368.ray + 0xf8) =
                           ~auVar87._8_4_ & (uint)fVar130 |
                           *(uint *)(local_368.ray + 0xf8) & auVar87._8_4_;
                      *(uint *)(local_368.ray + 0xfc) =
                           ~auVar87._12_4_ & (uint)fVar162 |
                           *(uint *)(local_368.ray + 0xfc) & auVar87._12_4_;
                      fVar128 = *(float *)(local_368.hit + 0x44);
                      fVar130 = *(float *)(local_368.hit + 0x48);
                      fVar162 = *(float *)(local_368.hit + 0x4c);
                      *(uint *)(local_368.ray + 0x100) =
                           ~auVar87._0_4_ & (uint)*(float *)(local_368.hit + 0x40) |
                           *(uint *)(local_368.ray + 0x100) & auVar87._0_4_;
                      *(uint *)(local_368.ray + 0x104) =
                           ~auVar87._4_4_ & (uint)fVar128 |
                           *(uint *)(local_368.ray + 0x104) & auVar87._4_4_;
                      *(uint *)(local_368.ray + 0x108) =
                           ~auVar87._8_4_ & (uint)fVar130 |
                           *(uint *)(local_368.ray + 0x108) & auVar87._8_4_;
                      *(uint *)(local_368.ray + 0x10c) =
                           ~auVar87._12_4_ & (uint)fVar162 |
                           *(uint *)(local_368.ray + 0x10c) & auVar87._12_4_;
                      fVar128 = *(float *)(local_368.hit + 0x54);
                      fVar130 = *(float *)(local_368.hit + 0x58);
                      fVar162 = *(float *)(local_368.hit + 0x5c);
                      *(uint *)(local_368.ray + 0x110) =
                           *(uint *)(local_368.ray + 0x110) & auVar87._0_4_ |
                           ~auVar87._0_4_ & (uint)*(float *)(local_368.hit + 0x50);
                      *(uint *)(local_368.ray + 0x114) =
                           *(uint *)(local_368.ray + 0x114) & auVar87._4_4_ |
                           ~auVar87._4_4_ & (uint)fVar128;
                      *(uint *)(local_368.ray + 0x118) =
                           *(uint *)(local_368.ray + 0x118) & auVar87._8_4_ |
                           ~auVar87._8_4_ & (uint)fVar130;
                      *(uint *)(local_368.ray + 0x11c) =
                           *(uint *)(local_368.ray + 0x11c) & auVar87._12_4_ |
                           ~auVar87._12_4_ & (uint)fVar162;
                      fVar128 = *(float *)(local_368.hit + 100);
                      fVar130 = *(float *)(local_368.hit + 0x68);
                      fVar162 = *(float *)(local_368.hit + 0x6c);
                      *(uint *)(local_368.ray + 0x120) =
                           *(uint *)(local_368.ray + 0x120) & auVar87._0_4_ |
                           ~auVar87._0_4_ & (uint)*(float *)(local_368.hit + 0x60);
                      *(uint *)(local_368.ray + 0x124) =
                           *(uint *)(local_368.ray + 0x124) & auVar87._4_4_ |
                           ~auVar87._4_4_ & (uint)fVar128;
                      *(uint *)(local_368.ray + 0x128) =
                           *(uint *)(local_368.ray + 0x128) & auVar87._8_4_ |
                           ~auVar87._8_4_ & (uint)fVar130;
                      *(uint *)(local_368.ray + 300) =
                           *(uint *)(local_368.ray + 300) & auVar87._12_4_ |
                           ~auVar87._12_4_ & (uint)fVar162;
                      fVar128 = *(float *)(local_368.hit + 0x74);
                      fVar130 = *(float *)(local_368.hit + 0x78);
                      fVar162 = *(float *)(local_368.hit + 0x7c);
                      *(uint *)(local_368.ray + 0x130) =
                           ~auVar87._0_4_ & (uint)*(float *)(local_368.hit + 0x70) |
                           *(uint *)(local_368.ray + 0x130) & auVar87._0_4_;
                      *(uint *)(local_368.ray + 0x134) =
                           ~auVar87._4_4_ & (uint)fVar128 |
                           *(uint *)(local_368.ray + 0x134) & auVar87._4_4_;
                      *(uint *)(local_368.ray + 0x138) =
                           ~auVar87._8_4_ & (uint)fVar130 |
                           *(uint *)(local_368.ray + 0x138) & auVar87._8_4_;
                      *(uint *)(local_368.ray + 0x13c) =
                           ~auVar87._12_4_ & (uint)fVar162 |
                           *(uint *)(local_368.ray + 0x13c) & auVar87._12_4_;
                      *(undefined1 (*) [16])(local_368.ray + 0x140) =
                           ~auVar87 & *(undefined1 (*) [16])(local_368.hit + 0x80) |
                           *(undefined1 (*) [16])(local_368.ray + 0x140) & auVar87;
                      pRVar38 = (RayHitK<4> *)local_368.ray;
                    }
                  }
                  auVar124._0_4_ = auVar123._0_4_ << 0x1f;
                  auVar124._4_4_ = auVar123._4_4_ << 0x1f;
                  auVar124._8_4_ = auVar123._8_4_ << 0x1f;
                  auVar124._12_4_ = auVar123._12_4_ << 0x1f;
                  iVar32 = movmskps((int)pRVar38,auVar124);
                  if (iVar32 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                  }
                  else {
                    local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_518._4_4_ = 0;
                    fStack_510 = 0.0;
                    uStack_50c = 0;
                  }
                  *(undefined4 *)(local_428 + lVar41 * 4) = 0;
                  local_428._0_4_ = -(uint)(fVar188 <= (float)local_518._0_4_) & local_428._0_4_;
                  local_428._4_4_ = -(uint)(fVar189 <= (float)local_518._0_4_) & local_428._4_4_;
                  local_428._8_4_ = -(uint)(fVar144 <= (float)local_518._0_4_) & local_428._8_4_;
                  local_428._12_4_ = -(uint)(fVar157 <= (float)local_518._0_4_) & local_428._12_4_;
                  uVar48 = movmskps(iVar32,local_428);
                  if (uVar48 == 0) break;
                  auVar125._0_4_ = local_428._0_4_ & (uint)fVar188;
                  auVar125._4_4_ = local_428._4_4_ & (uint)fVar189;
                  auVar125._8_4_ = local_428._8_4_ & (uint)fVar144;
                  auVar125._12_4_ = local_428._12_4_ & (uint)fVar157;
                  auVar141._0_8_ = CONCAT44(~local_428._4_4_,~local_428._0_4_) & 0x7f8000007f800000;
                  auVar141._8_4_ = ~local_428._8_4_ & 0x7f800000;
                  auVar141._12_4_ = ~local_428._12_4_ & 0x7f800000;
                  auVar141 = auVar141 | auVar125;
                  auVar156._4_4_ = auVar141._0_4_;
                  auVar156._0_4_ = auVar141._4_4_;
                  auVar156._8_4_ = auVar141._12_4_;
                  auVar156._12_4_ = auVar141._8_4_;
                  auVar180 = minps(auVar156,auVar141);
                  auVar126._0_8_ = auVar180._8_8_;
                  auVar126._8_4_ = auVar180._0_4_;
                  auVar126._12_4_ = auVar180._4_4_;
                  auVar180 = minps(auVar126,auVar180);
                  auVar127._0_8_ =
                       CONCAT44(-(uint)(auVar180._4_4_ == auVar141._4_4_) & local_428._4_4_,
                                -(uint)(auVar180._0_4_ == auVar141._0_4_) & local_428._0_4_);
                  auVar127._8_4_ = -(uint)(auVar180._8_4_ == auVar141._8_4_) & local_428._8_4_;
                  auVar127._12_4_ = -(uint)(auVar180._12_4_ == auVar141._12_4_) & local_428._12_4_;
                  iVar32 = movmskps(uVar48,auVar127);
                  auVar88 = local_428;
                  if (iVar32 != 0) {
                    auVar88._8_4_ = auVar127._8_4_;
                    auVar88._0_8_ = auVar127._0_8_;
                    auVar88._12_4_ = auVar127._12_4_;
                  }
                  uVar34 = movmskps(iVar32,auVar88);
                  uVar43 = CONCAT44((int)((ulong)pRVar38 >> 0x20),uVar34);
                  lVar41 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                    }
                  }
                }
              }
              prim = local_3f0;
              pre = local_3f8;
              pLVar44 = local_400;
              fVar128 = (float)local_3a8._0_4_;
              fVar130 = (float)local_308._0_4_;
            }
          }
        }
      }
      local_308._0_4_ = fVar130;
      local_3a8._0_4_ = fVar128;
      if (4 < iVar6) {
        local_58 = iVar6;
        iStack_54 = iVar6;
        iStack_50 = iVar6;
        iStack_4c = iVar6;
        fStack_384 = local_388;
        fStack_380 = local_388;
        fStack_37c = local_388;
        local_3a8._4_4_ = local_3a8._0_4_;
        fStack_3a0 = (float)local_3a8._0_4_;
        fStack_39c = (float)local_3a8._0_4_;
        local_98 = 1.0 / (float)local_308._0_4_;
        fStack_94 = local_98;
        fStack_90 = local_98;
        fStack_8c = local_98;
        local_78 = uVar46;
        uStack_74 = uVar46;
        uStack_70 = uVar46;
        uStack_6c = uVar46;
        local_88 = uVar47;
        uStack_84 = uVar47;
        uStack_80 = uVar47;
        uStack_7c = uVar47;
        lVar41 = 4;
        do {
          local_218 = (uint)lVar41;
          pauVar2 = (undefined1 (*) [12])(catmullrom_basis0 + lVar41 * 4 + lVar9);
          fVar128 = *(float *)*pauVar2;
          fVar130 = *(float *)(*pauVar2 + 4);
          fVar162 = *(float *)(*pauVar2 + 8);
          auVar12 = *pauVar2;
          fVar172 = *(float *)pauVar2[1];
          pfVar1 = (float *)(lVar9 + 0x21b37f0 + lVar41 * 4);
          local_338 = *pfVar1;
          fStack_334 = pfVar1[1];
          fStack_330 = pfVar1[2];
          fStack_32c = pfVar1[3];
          pfVar1 = (float *)(lVar9 + 0x21b3c74 + lVar41 * 4);
          local_278 = *pfVar1;
          fStack_274 = pfVar1[1];
          fStack_270 = pfVar1[2];
          fStack_26c = pfVar1[3];
          pfVar1 = (float *)(lVar9 + 0x21b40f8 + lVar41 * 4);
          fVar173 = *pfVar1;
          fVar190 = pfVar1[1];
          fVar174 = pfVar1[2];
          fVar188 = pfVar1[3];
          local_268 = local_138 * fVar128 +
                      local_2e8 * local_338 + fVar197 * local_278 + fVar142 * fVar173;
          fStack_264 = fStack_134 * fVar130 +
                       fStack_2e4 * fStack_334 + fVar197 * fStack_274 + fVar142 * fVar190;
          fStack_260 = fStack_130 * fVar162 +
                       fStack_2e0 * fStack_330 + fVar197 * fStack_270 + fVar142 * fVar174;
          fStack_25c = fStack_12c * fVar172 +
                       fStack_2dc * fStack_32c + fVar197 * fStack_26c + fVar142 * fVar188;
          local_258 = local_188 * fVar128 +
                      local_398 * local_338 + local_328 * local_278 + local_2d8 * fVar173;
          fStack_254 = fStack_184 * fVar130 +
                       fStack_394 * fStack_334 + fStack_324 * fStack_274 + fStack_2d4 * fVar190;
          fStack_250 = fStack_180 * fVar162 +
                       fStack_390 * fStack_330 + fStack_320 * fStack_270 + fStack_2d0 * fVar174;
          fStack_24c = fStack_17c * fVar172 +
                       fStack_38c * fStack_32c + fStack_31c * fStack_26c + fStack_2cc * fVar188;
          auVar214._0_4_ =
               local_178 * fVar128 +
               local_168 * local_338 + local_148 * local_278 + local_158 * fVar173;
          auVar214._4_4_ =
               fStack_174 * fVar130 +
               fStack_164 * fStack_334 + fStack_144 * fStack_274 + fStack_154 * fVar190;
          auVar214._8_4_ =
               fStack_170 * fVar162 +
               fStack_160 * fStack_330 + fStack_140 * fStack_270 + fStack_150 * fVar174;
          auVar214._12_4_ =
               fStack_16c * fVar172 +
               fStack_15c * fStack_32c + fStack_13c * fStack_26c + fStack_14c * fVar188;
          puVar36 = catmullrom_basis1 + lVar9;
          pfVar1 = (float *)(puVar36 + lVar41 * 4);
          fVar128 = *pfVar1;
          fVar130 = pfVar1[1];
          fVar162 = pfVar1[2];
          fVar189 = pfVar1[3];
          pfVar1 = (float *)(lVar9 + 0x21b5c10 + lVar41 * 4);
          fVar144 = *pfVar1;
          fVar157 = pfVar1[1];
          fVar159 = pfVar1[2];
          fVar195 = pfVar1[3];
          pfVar1 = (float *)(lVar9 + 0x21b6094 + lVar41 * 4);
          fVar215 = *pfVar1;
          fVar218 = pfVar1[1];
          fVar223 = pfVar1[2];
          fVar226 = pfVar1[3];
          pfVar1 = (float *)(lVar9 + 0x21b6518 + lVar41 * 4);
          fVar227 = *pfVar1;
          fVar228 = pfVar1[1];
          fVar230 = pfVar1[2];
          fVar231 = pfVar1[3];
          fVar246 = local_138 * fVar128 +
                    local_2e8 * fVar144 + fVar197 * fVar215 + fVar142 * fVar227;
          fVar248 = fStack_134 * fVar130 +
                    fStack_2e4 * fVar157 + fVar197 * fVar218 + fVar142 * fVar228;
          fVar250 = fStack_130 * fVar162 +
                    fStack_2e0 * fVar159 + fVar197 * fVar223 + fVar142 * fVar230;
          fVar252 = fStack_12c * fVar189 +
                    fStack_2dc * fVar195 + fVar197 * fVar226 + fVar142 * fVar231;
          fVar257 = local_188 * fVar128 +
                    local_398 * fVar144 + local_328 * fVar215 + local_2d8 * fVar227;
          fVar259 = fStack_184 * fVar130 +
                    fStack_394 * fVar157 + fStack_324 * fVar218 + fStack_2d4 * fVar228;
          fVar261 = fStack_180 * fVar162 +
                    fStack_390 * fVar159 + fStack_320 * fVar223 + fStack_2d0 * fVar230;
          fVar199 = fStack_17c * fVar189 +
                    fStack_38c * fVar195 + fStack_31c * fVar226 + fStack_2cc * fVar231;
          local_2f8._0_4_ =
               local_178 * fVar128 + local_168 * fVar144 + local_148 * fVar215 + local_158 * fVar227
          ;
          local_2f8._4_4_ =
               fStack_174 * fVar130 +
               fStack_164 * fVar157 + fStack_144 * fVar218 + fStack_154 * fVar228;
          fStack_2f0 = fStack_170 * fVar162 +
                       fStack_160 * fVar159 + fStack_140 * fVar223 + fStack_150 * fVar230;
          fStack_2ec = fStack_16c * fVar189 +
                       fStack_15c * fVar195 + fStack_13c * fVar226 + fStack_14c * fVar231;
          fVar234 = fVar246 - local_268;
          fVar235 = fVar248 - fStack_264;
          fVar236 = fVar250 - fStack_260;
          fVar237 = fVar252 - fStack_25c;
          local_308._0_4_ = fVar257 - local_258;
          local_308._4_4_ = fVar259 - fStack_254;
          fStack_300 = fVar261 - fStack_250;
          fStack_2fc = fVar199 - fStack_24c;
          fVar217 = local_258 * fVar234 - local_268 * (float)local_308._0_4_;
          fVar220 = fStack_254 * fVar235 - fStack_264 * (float)local_308._4_4_;
          fVar222 = fStack_250 * fVar236 - fStack_260 * fStack_300;
          fVar232 = fStack_24c * fVar237 - fStack_25c * fStack_2fc;
          auVar132 = maxps(auVar214,_local_2f8);
          bVar29 = fVar217 * fVar217 <=
                   auVar132._0_4_ * auVar132._0_4_ *
                   (fVar234 * fVar234 + (float)local_308._0_4_ * (float)local_308._0_4_) &&
                   (int)local_218 < local_58;
          local_288._0_4_ = -(uint)bVar29;
          bVar30 = fVar220 * fVar220 <=
                   auVar132._4_4_ * auVar132._4_4_ *
                   (fVar235 * fVar235 + (float)local_308._4_4_ * (float)local_308._4_4_) &&
                   (int)(local_218 | 1) < iStack_54;
          local_288._4_4_ = -(uint)bVar30;
          bVar28 = fVar222 * fVar222 <=
                   auVar132._8_4_ * auVar132._8_4_ * (fVar236 * fVar236 + fStack_300 * fStack_300)
                   && (int)(local_218 | 2) < iStack_50;
          fStack_280 = (float)-(uint)bVar28;
          bVar27 = fVar232 * fVar232 <=
                   auVar132._12_4_ * auVar132._12_4_ * (fVar237 * fVar237 + fStack_2fc * fStack_2fc)
                   && (int)(local_218 | 3) < iStack_4c;
          register0x0000158c = -(uint)bVar27;
          uVar48 = movmskps((int)pGVar40,_local_288);
          pGVar40 = (Geometry *)(ulong)uVar48;
          if (uVar48 == 0) {
LAB_00a8977f:
            uVar48 = (uint)puVar36;
          }
          else {
            fVar97 = fVar227 * fVar129 + fVar215 * local_2c8 + fVar144 * local_378 +
                     fVar128 * fVar196;
            fVar99 = fVar228 * fVar129 + fVar218 * fStack_2c4 + fVar157 * fStack_374 +
                     fVar130 * fVar196;
            fVar145 = fVar230 * fVar129 + fVar223 * fStack_2c0 + fVar159 * fStack_370 +
                      fVar162 * fVar196;
            fVar158 = fVar231 * fVar129 + fVar226 * fStack_2bc + fVar195 * fStack_36c +
                      fVar189 * fVar196;
            local_448 = auVar12._0_4_;
            fStack_444 = auVar12._4_4_;
            fStack_440 = auVar12._8_4_;
            fVar219 = fVar173 * fVar129 + local_278 * local_2c8 + local_338 * local_378 +
                      local_448 * fVar196;
            fVar221 = fVar190 * fVar129 + fStack_274 * fStack_2c4 + fStack_334 * fStack_374 +
                      fStack_444 * fVar196;
            fVar238 = fVar174 * fVar129 + fStack_270 * fStack_2c0 + fStack_330 * fStack_370 +
                      fStack_440 * fVar196;
            fVar247 = fVar188 * fVar129 + fStack_26c * fStack_2bc + fStack_32c * fStack_36c +
                      fVar172 * fVar196;
            pfVar1 = (float *)(lVar9 + 0x21b457c + lVar41 * 4);
            fVar128 = *pfVar1;
            fVar130 = pfVar1[1];
            fVar162 = pfVar1[2];
            fVar172 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b4a00 + lVar41 * 4);
            fVar173 = *pfVar1;
            fVar190 = pfVar1[1];
            fVar174 = pfVar1[2];
            fVar188 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b4e84 + lVar41 * 4);
            fVar189 = *pfVar1;
            fVar144 = pfVar1[1];
            fVar157 = pfVar1[2];
            fVar159 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b5308 + lVar41 * 4);
            fVar195 = *pfVar1;
            fVar215 = pfVar1[1];
            fVar218 = pfVar1[2];
            fVar223 = pfVar1[3];
            fVar271 = local_138 * fVar128 +
                      local_2e8 * fVar173 + fVar197 * fVar189 + fVar142 * fVar195;
            fVar273 = fStack_134 * fVar130 +
                      fStack_2e4 * fVar190 + fVar197 * fVar144 + fVar142 * fVar215;
            fVar275 = fStack_130 * fVar162 +
                      fStack_2e0 * fVar174 + fVar197 * fVar157 + fVar142 * fVar218;
            fVar276 = fStack_12c * fVar172 +
                      fStack_2dc * fVar188 + fVar197 * fVar159 + fVar142 * fVar223;
            fVar160 = local_188 * fVar128 +
                      local_398 * fVar173 + local_328 * fVar189 + local_2d8 * fVar195;
            fVar161 = fStack_184 * fVar130 +
                      fStack_394 * fVar190 + fStack_324 * fVar144 + fStack_2d4 * fVar215;
            fVar198 = fStack_180 * fVar162 +
                      fStack_390 * fVar174 + fStack_320 * fVar157 + fStack_2d0 * fVar218;
            fVar216 = fStack_17c * fVar172 +
                      fStack_38c * fVar188 + fStack_31c * fVar159 + fStack_2cc * fVar223;
            pfVar1 = (float *)(lVar9 + 0x21b699c + lVar41 * 4);
            fVar226 = *pfVar1;
            fVar227 = pfVar1[1];
            fVar228 = pfVar1[2];
            fVar230 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b72a4 + lVar41 * 4);
            fVar231 = *pfVar1;
            fVar217 = pfVar1[1];
            fVar220 = pfVar1[2];
            fVar222 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b7728 + lVar41 * 4);
            fVar232 = *pfVar1;
            fVar233 = pfVar1[1];
            fVar253 = pfVar1[2];
            fVar258 = pfVar1[3];
            pfVar1 = (float *)(lVar9 + 0x21b6e20 + lVar41 * 4);
            fVar260 = *pfVar1;
            fVar262 = pfVar1[1];
            fVar55 = pfVar1[2];
            fVar93 = pfVar1[3];
            fVar277 = local_138 * fVar226 +
                      local_2e8 * fVar260 + fVar197 * fVar231 + fVar142 * fVar232;
            fVar278 = fStack_134 * fVar227 +
                      fStack_2e4 * fVar262 + fVar197 * fVar217 + fVar142 * fVar233;
            fVar272 = fStack_130 * fVar228 +
                      fStack_2e0 * fVar55 + fVar197 * fVar220 + fVar142 * fVar253;
            fVar274 = fStack_12c * fVar230 +
                      fStack_2dc * fVar93 + fVar197 * fVar222 + fVar142 * fVar258;
            fVar249 = local_188 * fVar226 +
                      local_398 * fVar260 + local_328 * fVar231 + local_2d8 * fVar232;
            fVar251 = fStack_184 * fVar227 +
                      fStack_394 * fVar262 + fStack_324 * fVar217 + fStack_2d4 * fVar233;
            fVar267 = fStack_180 * fVar228 +
                      fStack_390 * fVar55 + fStack_320 * fVar220 + fStack_2d0 * fVar253;
            fVar270 = fStack_17c * fVar230 +
                      fStack_38c * fVar93 + fStack_31c * fVar222 + fStack_2cc * fVar258;
            auVar256._0_8_ = CONCAT44(fVar273,fVar271) & 0x7fffffff7fffffff;
            auVar256._8_4_ = ABS(fVar275);
            auVar256._12_4_ = ABS(fVar276);
            auVar185._0_8_ = CONCAT44(fVar161,fVar160) & 0x7fffffff7fffffff;
            auVar185._8_4_ = ABS(fVar198);
            auVar185._12_4_ = ABS(fVar216);
            auVar132 = maxps(auVar256,auVar185);
            auVar265._0_8_ =
                 CONCAT44(fVar130 * fVar196 +
                          fVar190 * fStack_374 + fVar144 * fStack_2c4 + fVar215 * fVar129,
                          fVar128 * fVar196 +
                          fVar173 * local_378 + fVar189 * local_2c8 + fVar195 * fVar129) &
                 0x7fffffff7fffffff;
            auVar265._8_4_ =
                 ABS(fVar162 * fVar196 +
                     fVar174 * fStack_370 + fVar157 * fStack_2c0 + fVar218 * fVar129);
            auVar265._12_4_ =
                 ABS(fVar172 * fVar196 +
                     fVar188 * fStack_36c + fVar159 * fStack_2bc + fVar223 * fVar129);
            auVar132 = maxps(auVar132,auVar265);
            uVar48 = -(uint)(local_388 <= auVar132._0_4_);
            uVar50 = -(uint)(fStack_384 <= auVar132._4_4_);
            uVar49 = -(uint)(fStack_380 <= auVar132._8_4_);
            uVar51 = -(uint)(fStack_37c <= auVar132._12_4_);
            auVar186._0_4_ = ~uVar48 & (uint)fVar234;
            auVar186._4_4_ = ~uVar50 & (uint)fVar235;
            auVar186._8_4_ = ~uVar49 & (uint)fVar236;
            auVar186._12_4_ = ~uVar51 & (uint)fVar237;
            auVar245._0_4_ = (uint)fVar271 & uVar48;
            auVar245._4_4_ = (uint)fVar273 & uVar50;
            auVar245._8_4_ = (uint)fVar275 & uVar49;
            auVar245._12_4_ = (uint)fVar276 & uVar51;
            auVar245 = auVar245 | auVar186;
            fVar144 = (float)(~uVar48 & local_308._0_4_ | (uint)fVar160 & uVar48);
            fVar157 = (float)(~uVar50 & local_308._4_4_ | (uint)fVar161 & uVar50);
            fVar159 = (float)(~uVar49 & (uint)fStack_300 | (uint)fVar198 & uVar49);
            fVar160 = (float)(~uVar51 & (uint)fStack_2fc | (uint)fVar216 & uVar51);
            auVar266._0_8_ = CONCAT44(fVar278,fVar277) & 0x7fffffff7fffffff;
            auVar266._8_4_ = ABS(fVar272);
            auVar266._12_4_ = ABS(fVar274);
            auVar136._0_8_ = CONCAT44(fVar251,fVar249) & 0x7fffffff7fffffff;
            auVar136._8_4_ = ABS(fVar267);
            auVar136._12_4_ = ABS(fVar270);
            auVar132 = maxps(auVar266,auVar136);
            auVar83._0_8_ =
                 CONCAT44(fVar227 * fVar196 +
                          fVar262 * fStack_374 + fVar217 * fStack_2c4 + fVar233 * fVar129,
                          fVar226 * fVar196 +
                          fVar260 * local_378 + fVar231 * local_2c8 + fVar232 * fVar129) &
                 0x7fffffff7fffffff;
            auVar83._8_4_ =
                 ABS(fVar228 * fVar196 +
                     fVar55 * fStack_370 + fVar220 * fStack_2c0 + fVar253 * fVar129);
            auVar83._12_4_ =
                 ABS(fVar230 * fVar196 +
                     fVar93 * fStack_36c + fVar222 * fStack_2bc + fVar258 * fVar129);
            auVar132 = maxps(auVar132,auVar83);
            uVar48 = -(uint)(local_388 <= auVar132._0_4_);
            uVar50 = -(uint)(fStack_384 <= auVar132._4_4_);
            uVar49 = -(uint)(fStack_380 <= auVar132._8_4_);
            uVar51 = -(uint)(fStack_37c <= auVar132._12_4_);
            fVar217 = (float)((uint)fVar277 & uVar48 | ~uVar48 & (uint)fVar234);
            fVar220 = (float)((uint)fVar278 & uVar50 | ~uVar50 & (uint)fVar235);
            fVar222 = (float)((uint)fVar272 & uVar49 | ~uVar49 & (uint)fVar236);
            fVar232 = (float)((uint)fVar274 & uVar51 | ~uVar51 & (uint)fVar237);
            fVar230 = (float)(~uVar48 & local_308._0_4_ | (uint)fVar249 & uVar48);
            fVar231 = (float)(~uVar50 & local_308._4_4_ | (uint)fVar251 & uVar50);
            fVar235 = (float)(~uVar49 & (uint)fStack_300 | (uint)fVar267 & uVar49);
            fVar237 = (float)(~uVar51 & (uint)fStack_2fc | (uint)fVar270 & uVar51);
            fVar189 = auVar245._0_4_;
            fVar128 = auVar245._4_4_;
            fVar130 = auVar245._8_4_;
            fVar162 = auVar245._12_4_;
            auVar168._0_4_ = fVar144 * fVar144 + fVar189 * fVar189;
            auVar168._4_4_ = fVar157 * fVar157 + fVar128 * fVar128;
            auVar168._8_4_ = fVar159 * fVar159 + fVar130 * fVar130;
            auVar168._12_4_ = fVar160 * fVar160 + fVar162 * fVar162;
            auVar132 = rsqrtps(auVar186,auVar168);
            fVar172 = auVar132._0_4_;
            fVar173 = auVar132._4_4_;
            fVar190 = auVar132._8_4_;
            fVar174 = auVar132._12_4_;
            auVar187._0_4_ = fVar172 * fVar172 * auVar168._0_4_ * 0.5 * fVar172;
            auVar187._4_4_ = fVar173 * fVar173 * auVar168._4_4_ * 0.5 * fVar173;
            auVar187._8_4_ = fVar190 * fVar190 * auVar168._8_4_ * 0.5 * fVar190;
            auVar187._12_4_ = fVar174 * fVar174 * auVar168._12_4_ * 0.5 * fVar174;
            fVar188 = fVar172 * 1.5 - auVar187._0_4_;
            fVar215 = fVar173 * 1.5 - auVar187._4_4_;
            fVar223 = fVar190 * 1.5 - auVar187._8_4_;
            fVar227 = fVar174 * 1.5 - auVar187._12_4_;
            auVar169._0_4_ = fVar230 * fVar230 + fVar217 * fVar217;
            auVar169._4_4_ = fVar231 * fVar231 + fVar220 * fVar220;
            auVar169._8_4_ = fVar235 * fVar235 + fVar222 * fVar222;
            auVar169._12_4_ = fVar237 * fVar237 + fVar232 * fVar232;
            auVar132 = rsqrtps(auVar187,auVar169);
            fVar172 = auVar132._0_4_;
            fVar173 = auVar132._4_4_;
            fVar190 = auVar132._8_4_;
            fVar174 = auVar132._12_4_;
            fVar195 = fVar172 * 1.5 - fVar172 * fVar172 * auVar169._0_4_ * 0.5 * fVar172;
            fVar218 = fVar173 * 1.5 - fVar173 * fVar173 * auVar169._4_4_ * 0.5 * fVar173;
            fVar226 = fVar190 * 1.5 - fVar190 * fVar190 * auVar169._8_4_ * 0.5 * fVar190;
            fVar228 = fVar174 * 1.5 - fVar174 * fVar174 * auVar169._12_4_ * 0.5 * fVar174;
            fVar253 = fVar144 * fVar188 * auVar214._0_4_;
            fVar258 = fVar157 * fVar215 * auVar214._4_4_;
            fVar55 = fVar159 * fVar223 * auVar214._8_4_;
            fVar93 = fVar160 * fVar227 * auVar214._12_4_;
            fVar189 = -fVar189 * fVar188 * auVar214._0_4_;
            fVar144 = -fVar128 * fVar215 * auVar214._4_4_;
            fVar157 = -fVar130 * fVar223 * auVar214._8_4_;
            fVar159 = -fVar162 * fVar227 * auVar214._12_4_;
            fVar234 = fVar188 * 0.0 * auVar214._0_4_;
            fVar236 = fVar215 * 0.0 * auVar214._4_4_;
            fVar260 = fVar223 * 0.0 * auVar214._8_4_;
            fVar262 = fVar227 * 0.0 * auVar214._12_4_;
            fVar271 = fVar230 * fVar195 * (float)local_2f8._0_4_;
            fVar273 = fVar231 * fVar218 * (float)local_2f8._4_4_;
            fVar275 = fVar235 * fVar226 * fStack_2f0;
            fVar276 = fVar237 * fVar228 * fStack_2ec;
            fVar173 = fVar246 + fVar271;
            fVar190 = fVar248 + fVar273;
            fVar174 = fVar250 + fVar275;
            fVar188 = fVar252 + fVar276;
            fVar128 = -fVar217 * fVar195 * (float)local_2f8._0_4_;
            fVar130 = -fVar220 * fVar218 * (float)local_2f8._4_4_;
            fVar162 = -fVar222 * fVar226 * fStack_2f0;
            fVar172 = -fVar232 * fVar228 * fStack_2ec;
            fVar160 = fVar257 + fVar128;
            fVar161 = fVar259 + fVar130;
            fVar198 = fVar261 + fVar162;
            fVar216 = fVar199 + fVar172;
            fVar215 = fVar195 * 0.0 * (float)local_2f8._0_4_;
            fVar223 = fVar218 * 0.0 * (float)local_2f8._4_4_;
            fVar227 = fVar226 * 0.0 * fStack_2f0;
            fVar230 = fVar228 * 0.0 * fStack_2ec;
            fVar220 = local_268 - fVar253;
            fVar222 = fStack_264 - fVar258;
            fVar232 = fStack_260 - fVar55;
            fVar233 = fStack_25c - fVar93;
            fVar249 = fVar97 + fVar215;
            fVar251 = fVar99 + fVar223;
            fVar267 = fVar145 + fVar227;
            fVar270 = fVar158 + fVar230;
            fVar231 = local_258 - fVar189;
            fVar235 = fStack_254 - fVar144;
            fVar237 = fStack_250 - fVar157;
            fVar217 = fStack_24c - fVar159;
            fVar195 = fVar219 - fVar234;
            fVar218 = fVar221 - fVar236;
            fVar226 = fVar238 - fVar260;
            fVar228 = fVar247 - fVar262;
            uVar48 = -(uint)(0.0 < (fVar231 * (fVar249 - fVar195) - fVar195 * (fVar160 - fVar231)) *
                                   0.0 + (fVar195 * (fVar173 - fVar220) -
                                         (fVar249 - fVar195) * fVar220) * 0.0 +
                                         ((fVar160 - fVar231) * fVar220 -
                                         (fVar173 - fVar220) * fVar231));
            uVar50 = -(uint)(0.0 < (fVar235 * (fVar251 - fVar218) - fVar218 * (fVar161 - fVar235)) *
                                   0.0 + (fVar218 * (fVar190 - fVar222) -
                                         (fVar251 - fVar218) * fVar222) * 0.0 +
                                         ((fVar161 - fVar235) * fVar222 -
                                         (fVar190 - fVar222) * fVar235));
            uVar49 = -(uint)(0.0 < (fVar237 * (fVar267 - fVar226) - fVar226 * (fVar198 - fVar237)) *
                                   0.0 + (fVar226 * (fVar174 - fVar232) -
                                         (fVar267 - fVar226) * fVar232) * 0.0 +
                                         ((fVar198 - fVar237) * fVar232 -
                                         (fVar174 - fVar232) * fVar237));
            uVar51 = -(uint)(0.0 < (fVar217 * (fVar270 - fVar228) - fVar228 * (fVar216 - fVar217)) *
                                   0.0 + (fVar228 * (fVar188 - fVar233) -
                                         (fVar270 - fVar228) * fVar233) * 0.0 +
                                         ((fVar216 - fVar217) * fVar233 -
                                         (fVar188 - fVar233) * fVar217));
            fVar271 = (float)((uint)(fVar246 - fVar271) & uVar48 |
                             ~uVar48 & (uint)(local_268 + fVar253));
            fVar273 = (float)((uint)(fVar248 - fVar273) & uVar50 |
                             ~uVar50 & (uint)(fStack_264 + fVar258));
            fVar275 = (float)((uint)(fVar250 - fVar275) & uVar49 |
                             ~uVar49 & (uint)(fStack_260 + fVar55));
            fVar276 = (float)((uint)(fVar252 - fVar276) & uVar51 |
                             ~uVar51 & (uint)(fStack_25c + fVar93));
            fVar253 = (float)((uint)(fVar257 - fVar128) & uVar48 |
                             ~uVar48 & (uint)(local_258 + fVar189));
            fVar258 = (float)((uint)(fVar259 - fVar130) & uVar50 |
                             ~uVar50 & (uint)(fStack_254 + fVar144));
            fVar261 = (float)((uint)(fVar261 - fVar162) & uVar49 |
                             ~uVar49 & (uint)(fStack_250 + fVar157));
            fVar199 = (float)((uint)(fVar199 - fVar172) & uVar51 |
                             ~uVar51 & (uint)(fStack_24c + fVar159));
            fVar55 = (float)((uint)(fVar97 - fVar215) & uVar48 | ~uVar48 & (uint)(fVar219 + fVar234)
                            );
            fVar93 = (float)((uint)(fVar99 - fVar223) & uVar50 | ~uVar50 & (uint)(fVar221 + fVar236)
                            );
            fVar260 = (float)((uint)(fVar145 - fVar227) & uVar49 |
                             ~uVar49 & (uint)(fVar238 + fVar260));
            fVar262 = (float)((uint)(fVar158 - fVar230) & uVar51 |
                             ~uVar51 & (uint)(fVar247 + fVar262));
            fVar250 = (float)((uint)fVar220 & uVar48 | ~uVar48 & (uint)fVar173);
            fVar252 = (float)((uint)fVar222 & uVar50 | ~uVar50 & (uint)fVar190);
            fVar257 = (float)((uint)fVar232 & uVar49 | ~uVar49 & (uint)fVar174);
            fVar259 = (float)((uint)fVar233 & uVar51 | ~uVar51 & (uint)fVar188);
            fVar234 = (float)((uint)fVar231 & uVar48 | ~uVar48 & (uint)fVar160);
            fVar236 = (float)((uint)fVar235 & uVar50 | ~uVar50 & (uint)fVar161);
            fVar246 = (float)((uint)fVar237 & uVar49 | ~uVar49 & (uint)fVar198);
            fVar248 = (float)((uint)fVar217 & uVar51 | ~uVar51 & (uint)fVar216);
            fVar215 = (float)((uint)fVar195 & uVar48 | ~uVar48 & (uint)fVar249);
            fVar223 = (float)((uint)fVar218 & uVar50 | ~uVar50 & (uint)fVar251);
            fVar227 = (float)((uint)fVar226 & uVar49 | ~uVar49 & (uint)fVar267);
            fVar230 = (float)((uint)fVar228 & uVar51 | ~uVar51 & (uint)fVar270);
            fVar173 = (float)((uint)fVar173 & uVar48 | ~uVar48 & (uint)fVar220) - fVar271;
            fVar190 = (float)((uint)fVar190 & uVar50 | ~uVar50 & (uint)fVar222) - fVar273;
            fVar174 = (float)((uint)fVar174 & uVar49 | ~uVar49 & (uint)fVar232) - fVar275;
            fVar188 = (float)((uint)fVar188 & uVar51 | ~uVar51 & (uint)fVar233) - fVar276;
            fVar231 = (float)((uint)fVar160 & uVar48 | ~uVar48 & (uint)fVar231) - fVar253;
            fVar235 = (float)((uint)fVar161 & uVar50 | ~uVar50 & (uint)fVar235) - fVar258;
            fVar237 = (float)((uint)fVar198 & uVar49 | ~uVar49 & (uint)fVar237) - fVar261;
            fVar217 = (float)((uint)fVar216 & uVar51 | ~uVar51 & (uint)fVar217) - fVar199;
            fVar195 = (float)((uint)fVar249 & uVar48 | ~uVar48 & (uint)fVar195) - fVar55;
            fVar218 = (float)((uint)fVar251 & uVar50 | ~uVar50 & (uint)fVar218) - fVar93;
            fVar226 = (float)((uint)fVar267 & uVar49 | ~uVar49 & (uint)fVar226) - fVar260;
            fVar228 = (float)((uint)fVar270 & uVar51 | ~uVar51 & (uint)fVar228) - fVar262;
            fVar97 = fVar271 - fVar250;
            fVar99 = fVar273 - fVar252;
            fVar145 = fVar275 - fVar257;
            fVar158 = fVar276 - fVar259;
            fVar128 = fVar253 - fVar234;
            fVar130 = fVar258 - fVar236;
            fVar162 = fVar261 - fVar246;
            fVar172 = fVar199 - fVar248;
            fVar189 = fVar55 - fVar215;
            fVar144 = fVar93 - fVar223;
            fVar157 = fVar260 - fVar227;
            fVar159 = fVar262 - fVar230;
            fVar220 = (fVar253 * fVar195 - fVar55 * fVar231) * 0.0 +
                      (fVar55 * fVar173 - fVar271 * fVar195) * 0.0 +
                      (fVar271 * fVar231 - fVar253 * fVar173);
            fVar222 = (fVar258 * fVar218 - fVar93 * fVar235) * 0.0 +
                      (fVar93 * fVar190 - fVar273 * fVar218) * 0.0 +
                      (fVar273 * fVar235 - fVar258 * fVar190);
            auVar152._4_4_ = fVar222;
            auVar152._0_4_ = fVar220;
            fVar232 = (fVar261 * fVar226 - fVar260 * fVar237) * 0.0 +
                      (fVar260 * fVar174 - fVar275 * fVar226) * 0.0 +
                      (fVar275 * fVar237 - fVar261 * fVar174);
            fVar233 = (fVar199 * fVar228 - fVar262 * fVar217) * 0.0 +
                      (fVar262 * fVar188 - fVar276 * fVar228) * 0.0 +
                      (fVar276 * fVar217 - fVar199 * fVar188);
            auVar269._0_4_ =
                 (fVar234 * fVar189 - fVar215 * fVar128) * 0.0 +
                 (fVar215 * fVar97 - fVar250 * fVar189) * 0.0 +
                 (fVar250 * fVar128 - fVar234 * fVar97);
            auVar269._4_4_ =
                 (fVar236 * fVar144 - fVar223 * fVar130) * 0.0 +
                 (fVar223 * fVar99 - fVar252 * fVar144) * 0.0 +
                 (fVar252 * fVar130 - fVar236 * fVar99);
            auVar269._8_4_ =
                 (fVar246 * fVar157 - fVar227 * fVar162) * 0.0 +
                 (fVar227 * fVar145 - fVar257 * fVar157) * 0.0 +
                 (fVar257 * fVar162 - fVar246 * fVar145);
            auVar269._12_4_ =
                 (fVar248 * fVar159 - fVar230 * fVar172) * 0.0 +
                 (fVar230 * fVar158 - fVar259 * fVar159) * 0.0 +
                 (fVar259 * fVar172 - fVar248 * fVar158);
            auVar152._8_4_ = fVar232;
            auVar152._12_4_ = fVar233;
            auVar132 = maxps(auVar152,auVar269);
            bVar29 = auVar132._0_4_ <= 0.0 && bVar29;
            auVar153._0_4_ = -(uint)bVar29;
            bVar30 = auVar132._4_4_ <= 0.0 && bVar30;
            auVar153._4_4_ = -(uint)bVar30;
            bVar28 = auVar132._8_4_ <= 0.0 && bVar28;
            auVar153._8_4_ = -(uint)bVar28;
            bVar27 = auVar132._12_4_ <= 0.0 && bVar27;
            auVar153._12_4_ = -(uint)bVar27;
            iVar32 = movmskps((int)puVar36,auVar153);
            if (iVar32 == 0) {
              auVar138._8_8_ = uStack_3e0;
              auVar138._0_8_ = local_3e8;
              iVar32 = 0;
            }
            else {
              fVar215 = fVar128 * fVar195 - fVar189 * fVar231;
              fVar223 = fVar130 * fVar218 - fVar144 * fVar235;
              fVar227 = fVar162 * fVar226 - fVar157 * fVar237;
              fVar230 = fVar172 * fVar228 - fVar159 * fVar217;
              fVar189 = fVar189 * fVar173 - fVar195 * fVar97;
              fVar144 = fVar144 * fVar190 - fVar218 * fVar99;
              fVar157 = fVar157 * fVar174 - fVar226 * fVar145;
              fVar159 = fVar159 * fVar188 - fVar228 * fVar158;
              fVar128 = fVar97 * fVar231 - fVar128 * fVar173;
              fVar195 = fVar99 * fVar235 - fVar130 * fVar190;
              fVar218 = fVar145 * fVar237 - fVar162 * fVar174;
              fVar226 = fVar158 * fVar217 - fVar172 * fVar188;
              auVar137._0_4_ = fVar189 * 0.0 + fVar128;
              auVar137._4_4_ = fVar144 * 0.0 + fVar195;
              auVar137._8_4_ = fVar157 * 0.0 + fVar218;
              auVar137._12_4_ = fVar159 * 0.0 + fVar226;
              auVar194._0_4_ = fVar215 * 0.0 + auVar137._0_4_;
              auVar194._4_4_ = fVar223 * 0.0 + auVar137._4_4_;
              auVar194._8_4_ = fVar227 * 0.0 + auVar137._8_4_;
              auVar194._12_4_ = fVar230 * 0.0 + auVar137._12_4_;
              auVar132 = rcpps(auVar137,auVar194);
              fVar130 = auVar132._0_4_;
              fVar162 = auVar132._4_4_;
              fVar172 = auVar132._8_4_;
              fVar173 = auVar132._12_4_;
              fVar130 = (1.0 - auVar194._0_4_ * fVar130) * fVar130 + fVar130;
              fVar162 = (1.0 - auVar194._4_4_ * fVar162) * fVar162 + fVar162;
              fVar172 = (1.0 - auVar194._8_4_ * fVar172) * fVar172 + fVar172;
              fVar173 = (1.0 - auVar194._12_4_ * fVar173) * fVar173 + fVar173;
              fVar190 = (fVar55 * fVar128 + fVar253 * fVar189 + fVar271 * fVar215) * fVar130;
              fVar174 = (fVar93 * fVar195 + fVar258 * fVar144 + fVar273 * fVar223) * fVar162;
              fVar188 = (fVar260 * fVar218 + fVar261 * fVar157 + fVar275 * fVar227) * fVar172;
              fVar189 = (fVar262 * fVar226 + fVar199 * fVar159 + fVar276 * fVar230) * fVar173;
              fVar128 = *(float *)(ray + k * 4 + 0x80);
              bVar29 = (fVar190 <= fVar128 && (float)local_3a8._0_4_ <= fVar190) && bVar29;
              auVar170._0_4_ = -(uint)bVar29;
              bVar30 = (fVar174 <= fVar128 && (float)local_3a8._4_4_ <= fVar174) && bVar30;
              auVar170._4_4_ = -(uint)bVar30;
              bVar28 = (fVar188 <= fVar128 && fStack_3a0 <= fVar188) && bVar28;
              auVar170._8_4_ = -(uint)bVar28;
              bVar27 = (fVar189 <= fVar128 && fStack_39c <= fVar189) && bVar27;
              auVar170._12_4_ = -(uint)bVar27;
              iVar32 = movmskps(iVar32,auVar170);
              if (iVar32 == 0) {
                auVar138._8_8_ = uStack_3e0;
                auVar138._0_8_ = local_3e8;
                iVar32 = 0;
              }
              else {
                auVar171._0_8_ =
                     CONCAT44(-(uint)(auVar194._4_4_ != 0.0 && bVar30),
                              -(uint)(auVar194._0_4_ != 0.0 && bVar29));
                auVar171._8_4_ = -(uint)(auVar194._8_4_ != 0.0 && bVar28);
                auVar171._12_4_ = -(uint)(auVar194._12_4_ != 0.0 && bVar27);
                iVar32 = movmskps(iVar32,auVar171);
                auVar138._8_8_ = uStack_3e0;
                auVar138._0_8_ = local_3e8;
                if (iVar32 != 0) {
                  fVar220 = fVar220 * fVar130;
                  fVar222 = fVar222 * fVar162;
                  fVar232 = fVar232 * fVar172;
                  fVar233 = fVar233 * fVar173;
                  local_68 = (float)((uint)(1.0 - fVar220) & uVar48 | ~uVar48 & (uint)fVar220);
                  fStack_64 = (float)((uint)(1.0 - fVar222) & uVar50 | ~uVar50 & (uint)fVar222);
                  fStack_60 = (float)((uint)(1.0 - fVar232) & uVar49 | ~uVar49 & (uint)fVar232);
                  fStack_5c = (float)((uint)(1.0 - fVar233) & uVar51 | ~uVar51 & (uint)fVar233);
                  local_2b8 = (float)(~uVar48 & (uint)(auVar269._0_4_ * fVar130) |
                                     (uint)(1.0 - auVar269._0_4_ * fVar130) & uVar48);
                  fStack_2b4 = (float)(~uVar50 & (uint)(auVar269._4_4_ * fVar162) |
                                      (uint)(1.0 - auVar269._4_4_ * fVar162) & uVar50);
                  fStack_2b0 = (float)(~uVar49 & (uint)(auVar269._8_4_ * fVar172) |
                                      (uint)(1.0 - auVar269._8_4_ * fVar172) & uVar49);
                  fStack_2ac = (float)(~uVar51 & (uint)(auVar269._12_4_ * fVar173) |
                                      (uint)(1.0 - auVar269._12_4_ * fVar173) & uVar51);
                  auVar138._8_4_ = auVar171._8_4_;
                  auVar138._0_8_ = auVar171._0_8_;
                  auVar138._12_4_ = auVar171._12_4_;
                  local_2a8 = fVar190;
                  fStack_2a4 = fVar174;
                  fStack_2a0 = fVar188;
                  fStack_29c = fVar189;
                }
              }
            }
            uVar48 = movmskps(iVar32,auVar138);
            if (uVar48 != 0) {
              fVar130 = ((float)local_2f8._0_4_ - auVar214._0_4_) * local_68 + auVar214._0_4_;
              fVar162 = ((float)local_2f8._4_4_ - auVar214._4_4_) * fStack_64 + auVar214._4_4_;
              fVar172 = (fStack_2f0 - auVar214._8_4_) * fStack_60 + auVar214._8_4_;
              fVar173 = (fStack_2ec - auVar214._12_4_) * fStack_5c + auVar214._12_4_;
              fVar128 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              local_428._0_4_ = -(uint)(fVar128 * (fVar130 + fVar130) < local_2a8) & auVar138._0_4_;
              local_428._4_4_ = -(uint)(fVar128 * (fVar162 + fVar162) < fStack_2a4) & auVar138._4_4_
              ;
              local_428._8_4_ = -(uint)(fVar128 * (fVar172 + fVar172) < fStack_2a0) & auVar138._8_4_
              ;
              local_428._12_4_ =
                   -(uint)(fVar128 * (fVar173 + fVar173) < fStack_29c) & auVar138._12_4_;
              uVar48 = movmskps(uVar48,local_428);
              if (uVar48 != 0) {
                local_2b8 = local_2b8 + local_2b8 + -1.0;
                fStack_2b4 = fStack_2b4 + fStack_2b4 + -1.0;
                fStack_2b0 = fStack_2b0 + fStack_2b0 + -1.0;
                fStack_2ac = fStack_2ac + fStack_2ac + -1.0;
                local_248 = local_68;
                fStack_244 = fStack_64;
                fStack_240 = fStack_60;
                fStack_23c = fStack_5c;
                local_228._4_4_ = fStack_2a4;
                local_228._0_4_ = local_2a8;
                fStack_220 = fStack_2a0;
                fStack_21c = fStack_29c;
                local_208 = CONCAT44(fStack_3b4,local_3b8);
                uStack_200 = CONCAT44(fStack_3ac,fStack_3b0);
                local_1e8 = CONCAT44(fStack_3c4,local_3c8);
                uStack_1e0 = CONCAT44(fStack_3bc,fStack_3c0);
                local_1d8 = CONCAT44(fStack_3d4,local_3d8);
                uStack_1d0 = CONCAT44(fStack_3cc,fStack_3d0);
                pGVar40 = (context->scene->geometries).items[uVar46].ptr;
                uVar48 = *(uint *)(ray + k * 4 + 0x90);
                puVar36 = (undefined1 *)(ulong)uVar48;
                if ((pGVar40->mask & uVar48) != 0) {
                  fVar128 = (float)(int)local_218;
                  local_1b8[0] = (fVar128 + local_68 + 0.0) * local_98;
                  local_1b8[1] = (fVar128 + fStack_64 + 1.0) * fStack_94;
                  local_1b8[2] = (fVar128 + fStack_60 + 2.0) * fStack_90;
                  local_1b8[3] = (fVar128 + fStack_5c + 3.0) * fStack_8c;
                  local_1a8 = CONCAT44(fStack_2b4,local_2b8);
                  uStack_1a0 = CONCAT44(fStack_2ac,fStack_2b0);
                  local_198._4_4_ = fStack_2a4;
                  local_198._0_4_ = local_2a8;
                  fStack_190 = fStack_2a0;
                  fStack_18c = fStack_29c;
                  auVar115._0_4_ = local_428._0_4_ & (uint)local_2a8;
                  auVar115._4_4_ = local_428._4_4_ & (uint)fStack_2a4;
                  auVar115._8_4_ = local_428._8_4_ & (uint)fStack_2a0;
                  auVar115._12_4_ = local_428._12_4_ & (uint)fStack_29c;
                  auVar139._0_8_ = CONCAT44(~local_428._4_4_,~local_428._0_4_) & 0x7f8000007f800000;
                  auVar139._8_4_ = ~local_428._8_4_ & 0x7f800000;
                  auVar139._12_4_ = ~local_428._12_4_ & 0x7f800000;
                  auVar139 = auVar139 | auVar115;
                  auVar154._4_4_ = auVar139._0_4_;
                  auVar154._0_4_ = auVar139._4_4_;
                  auVar154._8_4_ = auVar139._12_4_;
                  auVar154._12_4_ = auVar139._8_4_;
                  auVar132 = minps(auVar154,auVar139);
                  auVar116._0_8_ = auVar132._8_8_;
                  auVar116._8_4_ = auVar132._0_4_;
                  auVar116._12_4_ = auVar132._4_4_;
                  auVar132 = minps(auVar116,auVar132);
                  auVar117._0_8_ =
                       CONCAT44(-(uint)(auVar132._4_4_ == auVar139._4_4_) & local_428._4_4_,
                                -(uint)(auVar132._0_4_ == auVar139._0_4_) & local_428._0_4_);
                  auVar117._8_4_ = -(uint)(auVar132._8_4_ == auVar139._8_4_) & local_428._8_4_;
                  auVar117._12_4_ = -(uint)(auVar132._12_4_ == auVar139._12_4_) & local_428._12_4_;
                  iVar32 = movmskps(uVar48,auVar117);
                  auVar84 = local_428;
                  if (iVar32 != 0) {
                    auVar84._8_4_ = auVar117._8_4_;
                    auVar84._0_8_ = auVar117._0_8_;
                    auVar84._12_4_ = auVar117._12_4_;
                  }
                  uVar48 = movmskps(iVar32,auVar84);
                  lVar45 = 0;
                  if (uVar48 != 0) {
                    for (; (uVar48 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar40->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar128 = local_1b8[lVar45];
                    fVar130 = 1.0 - fVar128;
                    fVar172 = fVar128 * 3.0;
                    fVar173 = ((fVar172 + 2.0) * (fVar130 + fVar130) + fVar130 * -3.0 * fVar130) *
                              0.5;
                    fVar162 = (fVar130 * -2.0 * fVar128 + fVar128 * fVar128) * 0.5;
                    fVar172 = (fVar128 * fVar172 + (fVar172 + -5.0) * (fVar128 + fVar128)) * 0.5;
                    uVar34 = *(undefined4 *)((long)&local_1a8 + lVar45 * 4);
                    fVar130 = (fVar128 * (fVar130 + fVar130) - fVar130 * fVar130) * 0.5;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_198 + lVar45 * 4);
                    *(float *)(ray + k * 4 + 0xc0) =
                         fVar130 * local_3b8 +
                         fVar172 * fVar92 + fVar173 * local_3c8 + fVar162 * local_3d8;
                    *(float *)(ray + k * 4 + 0xd0) =
                         fVar130 * fStack_3b4 +
                         fVar172 * fVar95 + fVar173 * fStack_3c4 + fVar162 * fStack_3d4;
                    *(float *)(ray + k * 4 + 0xe0) =
                         fVar130 * fStack_3b0 +
                         fVar172 * fVar96 + fVar173 * fStack_3c0 + fVar162 * fStack_3d0;
                    *(float *)(ray + k * 4 + 0xf0) = fVar128;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar34;
                    *(uint *)(ray + k * 4 + 0x110) = uVar47;
                    *(uint *)(ray + k * 4 + 0x120) = uVar46;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar48 = context->user->instPrimID[0];
                    puVar36 = (undefined1 *)(ulong)uVar48;
                    *(uint *)(ray + k * 4 + 0x140) = uVar48;
                    prim = local_3f0;
                    pre = local_3f8;
                    pLVar44 = local_400;
                  }
                  else {
                    auVar12 = *(undefined1 (*) [12])*local_318;
                    uStack_4bc = (undefined4)((ulong)*(undefined8 *)(*local_318 + 8) >> 0x20);
                    _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    local_238 = local_2b8;
                    fStack_234 = fStack_2b4;
                    fStack_230 = fStack_2b0;
                    fStack_22c = fStack_2ac;
                    local_214 = iVar6;
                    local_1f8 = fVar92;
                    fStack_1f4 = fVar95;
                    fStack_1f0 = fVar96;
                    fStack_1ec = fVar101;
                    local_1c8 = local_428;
                    while( true ) {
                      local_f8 = local_1b8[lVar45];
                      local_e8 = *(undefined4 *)((long)&local_1a8 + lVar45 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_198 + lVar45 * 4);
                      fVar173 = 1.0 - local_f8;
                      fVar128 = local_f8 * 3.0;
                      fVar172 = ((fVar128 + 2.0) * (fVar173 + fVar173) + fVar173 * -3.0 * fVar173) *
                                0.5;
                      fVar130 = (local_f8 * local_f8 + fVar173 * -2.0 * local_f8) * 0.5;
                      fVar162 = (local_f8 * fVar128 + (fVar128 + -5.0) * (local_f8 + local_f8)) *
                                0.5;
                      local_368.context = context->user;
                      fVar128 = (local_f8 * (fVar173 + fVar173) - fVar173 * fVar173) * 0.5;
                      local_128 = fVar128 * local_3b8 +
                                  fVar162 * fVar92 + fVar172 * local_3c8 + fVar130 * local_3d8;
                      local_118 = fVar128 * fStack_3b4 +
                                  fVar162 * fVar95 + fVar172 * fStack_3c4 + fVar130 * fStack_3d4;
                      local_108 = fVar128 * fStack_3b0 +
                                  fVar162 * fVar96 + fVar172 * fStack_3c0 + fVar130 * fStack_3d0;
                      fStack_124 = local_128;
                      fStack_120 = local_128;
                      fStack_11c = local_128;
                      fStack_114 = local_118;
                      fStack_110 = local_118;
                      fStack_10c = local_118;
                      fStack_104 = local_108;
                      fStack_100 = local_108;
                      fStack_fc = local_108;
                      fStack_f4 = local_f8;
                      fStack_f0 = local_f8;
                      fStack_ec = local_f8;
                      uStack_e4 = local_e8;
                      uStack_e0 = local_e8;
                      uStack_dc = local_e8;
                      local_d8 = CONCAT44(uStack_84,local_88);
                      uStack_d0 = CONCAT44(uStack_7c,uStack_80);
                      local_c8 = CONCAT44(uStack_74,local_78);
                      uStack_c0 = CONCAT44(uStack_6c,uStack_70);
                      local_b8 = (local_368.context)->instID[0];
                      uStack_b4 = local_b8;
                      uStack_b0 = local_b8;
                      uStack_ac = local_b8;
                      local_a8 = (local_368.context)->instPrimID[0];
                      uStack_a4 = local_a8;
                      uStack_a0 = local_a8;
                      uStack_9c = local_a8;
                      local_418._12_4_ = uStack_4bc;
                      local_418._0_12_ = auVar12;
                      local_368.valid = (int *)local_418;
                      local_368.geometryUserPtr = pGVar40->userPtr;
                      local_368.hit = (RTCHitN *)&local_128;
                      local_368.N = 4;
                      p_Var37 = pGVar40->intersectionFilterN;
                      local_368.ray = (RTCRayN *)ray;
                      if (p_Var37 != (RTCFilterFunctionN)0x0) {
                        p_Var37 = (RTCFilterFunctionN)(*p_Var37)(&local_368);
                      }
                      auVar118._0_4_ = -(uint)(local_418._0_4_ == 0);
                      auVar118._4_4_ = -(uint)(local_418._4_4_ == 0);
                      auVar118._8_4_ = -(uint)(local_418._8_4_ == 0);
                      auVar118._12_4_ = -(uint)(local_418._12_4_ == 0);
                      uVar48 = movmskps((int)p_Var37,auVar118);
                      pRVar38 = (RayHitK<4> *)(ulong)(uVar48 ^ 0xf);
                      if ((uVar48 ^ 0xf) == 0) {
                        auVar118 = auVar118 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var37 = context->args->filter;
                        if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar40->field_8).field_0x2 & 0x40) != 0)))) {
                          p_Var37 = (RTCFilterFunctionN)(*p_Var37)(&local_368);
                        }
                        auVar85._0_4_ = -(uint)(local_418._0_4_ == 0);
                        auVar85._4_4_ = -(uint)(local_418._4_4_ == 0);
                        auVar85._8_4_ = -(uint)(local_418._8_4_ == 0);
                        auVar85._12_4_ = -(uint)(local_418._12_4_ == 0);
                        auVar118 = auVar85 ^ _DAT_01f7ae20;
                        uVar48 = movmskps((int)p_Var37,auVar85);
                        pRVar38 = (RayHitK<4> *)(ulong)(uVar48 ^ 0xf);
                        if ((uVar48 ^ 0xf) != 0) {
                          fVar128 = *(float *)(local_368.hit + 4);
                          fVar130 = *(float *)(local_368.hit + 8);
                          fVar162 = *(float *)(local_368.hit + 0xc);
                          *(uint *)(local_368.ray + 0xc0) =
                               ~auVar85._0_4_ & (uint)*(float *)local_368.hit |
                               *(uint *)(local_368.ray + 0xc0) & auVar85._0_4_;
                          *(uint *)(local_368.ray + 0xc4) =
                               ~auVar85._4_4_ & (uint)fVar128 |
                               *(uint *)(local_368.ray + 0xc4) & auVar85._4_4_;
                          *(uint *)(local_368.ray + 200) =
                               ~auVar85._8_4_ & (uint)fVar130 |
                               *(uint *)(local_368.ray + 200) & auVar85._8_4_;
                          *(uint *)(local_368.ray + 0xcc) =
                               ~auVar85._12_4_ & (uint)fVar162 |
                               *(uint *)(local_368.ray + 0xcc) & auVar85._12_4_;
                          fVar128 = *(float *)(local_368.hit + 0x14);
                          fVar130 = *(float *)(local_368.hit + 0x18);
                          fVar162 = *(float *)(local_368.hit + 0x1c);
                          *(uint *)(local_368.ray + 0xd0) =
                               ~auVar85._0_4_ & (uint)*(float *)(local_368.hit + 0x10) |
                               *(uint *)(local_368.ray + 0xd0) & auVar85._0_4_;
                          *(uint *)(local_368.ray + 0xd4) =
                               ~auVar85._4_4_ & (uint)fVar128 |
                               *(uint *)(local_368.ray + 0xd4) & auVar85._4_4_;
                          *(uint *)(local_368.ray + 0xd8) =
                               ~auVar85._8_4_ & (uint)fVar130 |
                               *(uint *)(local_368.ray + 0xd8) & auVar85._8_4_;
                          *(uint *)(local_368.ray + 0xdc) =
                               ~auVar85._12_4_ & (uint)fVar162 |
                               *(uint *)(local_368.ray + 0xdc) & auVar85._12_4_;
                          fVar128 = *(float *)(local_368.hit + 0x24);
                          fVar130 = *(float *)(local_368.hit + 0x28);
                          fVar162 = *(float *)(local_368.hit + 0x2c);
                          *(uint *)(local_368.ray + 0xe0) =
                               ~auVar85._0_4_ & (uint)*(float *)(local_368.hit + 0x20) |
                               *(uint *)(local_368.ray + 0xe0) & auVar85._0_4_;
                          *(uint *)(local_368.ray + 0xe4) =
                               ~auVar85._4_4_ & (uint)fVar128 |
                               *(uint *)(local_368.ray + 0xe4) & auVar85._4_4_;
                          *(uint *)(local_368.ray + 0xe8) =
                               ~auVar85._8_4_ & (uint)fVar130 |
                               *(uint *)(local_368.ray + 0xe8) & auVar85._8_4_;
                          *(uint *)(local_368.ray + 0xec) =
                               ~auVar85._12_4_ & (uint)fVar162 |
                               *(uint *)(local_368.ray + 0xec) & auVar85._12_4_;
                          fVar128 = *(float *)(local_368.hit + 0x34);
                          fVar130 = *(float *)(local_368.hit + 0x38);
                          fVar162 = *(float *)(local_368.hit + 0x3c);
                          *(uint *)(local_368.ray + 0xf0) =
                               ~auVar85._0_4_ & (uint)*(float *)(local_368.hit + 0x30) |
                               *(uint *)(local_368.ray + 0xf0) & auVar85._0_4_;
                          *(uint *)(local_368.ray + 0xf4) =
                               ~auVar85._4_4_ & (uint)fVar128 |
                               *(uint *)(local_368.ray + 0xf4) & auVar85._4_4_;
                          *(uint *)(local_368.ray + 0xf8) =
                               ~auVar85._8_4_ & (uint)fVar130 |
                               *(uint *)(local_368.ray + 0xf8) & auVar85._8_4_;
                          *(uint *)(local_368.ray + 0xfc) =
                               ~auVar85._12_4_ & (uint)fVar162 |
                               *(uint *)(local_368.ray + 0xfc) & auVar85._12_4_;
                          fVar128 = *(float *)(local_368.hit + 0x44);
                          fVar130 = *(float *)(local_368.hit + 0x48);
                          fVar162 = *(float *)(local_368.hit + 0x4c);
                          *(uint *)(local_368.ray + 0x100) =
                               ~auVar85._0_4_ & (uint)*(float *)(local_368.hit + 0x40) |
                               *(uint *)(local_368.ray + 0x100) & auVar85._0_4_;
                          *(uint *)(local_368.ray + 0x104) =
                               ~auVar85._4_4_ & (uint)fVar128 |
                               *(uint *)(local_368.ray + 0x104) & auVar85._4_4_;
                          *(uint *)(local_368.ray + 0x108) =
                               ~auVar85._8_4_ & (uint)fVar130 |
                               *(uint *)(local_368.ray + 0x108) & auVar85._8_4_;
                          *(uint *)(local_368.ray + 0x10c) =
                               ~auVar85._12_4_ & (uint)fVar162 |
                               *(uint *)(local_368.ray + 0x10c) & auVar85._12_4_;
                          fVar128 = *(float *)(local_368.hit + 0x54);
                          fVar130 = *(float *)(local_368.hit + 0x58);
                          fVar162 = *(float *)(local_368.hit + 0x5c);
                          *(uint *)(local_368.ray + 0x110) =
                               *(uint *)(local_368.ray + 0x110) & auVar85._0_4_ |
                               ~auVar85._0_4_ & (uint)*(float *)(local_368.hit + 0x50);
                          *(uint *)(local_368.ray + 0x114) =
                               *(uint *)(local_368.ray + 0x114) & auVar85._4_4_ |
                               ~auVar85._4_4_ & (uint)fVar128;
                          *(uint *)(local_368.ray + 0x118) =
                               *(uint *)(local_368.ray + 0x118) & auVar85._8_4_ |
                               ~auVar85._8_4_ & (uint)fVar130;
                          *(uint *)(local_368.ray + 0x11c) =
                               *(uint *)(local_368.ray + 0x11c) & auVar85._12_4_ |
                               ~auVar85._12_4_ & (uint)fVar162;
                          fVar128 = *(float *)(local_368.hit + 100);
                          fVar130 = *(float *)(local_368.hit + 0x68);
                          fVar162 = *(float *)(local_368.hit + 0x6c);
                          *(uint *)(local_368.ray + 0x120) =
                               *(uint *)(local_368.ray + 0x120) & auVar85._0_4_ |
                               ~auVar85._0_4_ & (uint)*(float *)(local_368.hit + 0x60);
                          *(uint *)(local_368.ray + 0x124) =
                               *(uint *)(local_368.ray + 0x124) & auVar85._4_4_ |
                               ~auVar85._4_4_ & (uint)fVar128;
                          *(uint *)(local_368.ray + 0x128) =
                               *(uint *)(local_368.ray + 0x128) & auVar85._8_4_ |
                               ~auVar85._8_4_ & (uint)fVar130;
                          *(uint *)(local_368.ray + 300) =
                               *(uint *)(local_368.ray + 300) & auVar85._12_4_ |
                               ~auVar85._12_4_ & (uint)fVar162;
                          fVar128 = *(float *)(local_368.hit + 0x74);
                          fVar130 = *(float *)(local_368.hit + 0x78);
                          fVar162 = *(float *)(local_368.hit + 0x7c);
                          *(uint *)(local_368.ray + 0x130) =
                               ~auVar85._0_4_ & (uint)*(float *)(local_368.hit + 0x70) |
                               *(uint *)(local_368.ray + 0x130) & auVar85._0_4_;
                          *(uint *)(local_368.ray + 0x134) =
                               ~auVar85._4_4_ & (uint)fVar128 |
                               *(uint *)(local_368.ray + 0x134) & auVar85._4_4_;
                          *(uint *)(local_368.ray + 0x138) =
                               ~auVar85._8_4_ & (uint)fVar130 |
                               *(uint *)(local_368.ray + 0x138) & auVar85._8_4_;
                          *(uint *)(local_368.ray + 0x13c) =
                               ~auVar85._12_4_ & (uint)fVar162 |
                               *(uint *)(local_368.ray + 0x13c) & auVar85._12_4_;
                          *(undefined1 (*) [16])(local_368.ray + 0x140) =
                               ~auVar85 & *(undefined1 (*) [16])(local_368.hit + 0x80) |
                               *(undefined1 (*) [16])(local_368.ray + 0x140) & auVar85;
                          pRVar38 = (RayHitK<4> *)local_368.ray;
                        }
                      }
                      fVar172 = fStack_29c;
                      fVar162 = fStack_2a0;
                      fVar130 = fStack_2a4;
                      fVar128 = local_2a8;
                      auVar119._0_4_ = auVar118._0_4_ << 0x1f;
                      auVar119._4_4_ = auVar118._4_4_ << 0x1f;
                      auVar119._8_4_ = auVar118._8_4_ << 0x1f;
                      auVar119._12_4_ = auVar118._12_4_ << 0x1f;
                      uVar34 = (undefined4)((ulong)pRVar38 >> 0x20);
                      iVar32 = movmskps((int)pRVar38,auVar119);
                      if (iVar32 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                      }
                      else {
                        local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_518._4_4_ = 0;
                        fStack_510 = 0.0;
                        uStack_50c = 0;
                      }
                      *(undefined4 *)(local_428 + lVar45 * 4) = 0;
                      local_428._0_4_ = -(uint)(fVar128 <= (float)local_518._0_4_) & local_428._0_4_
                      ;
                      local_428._4_4_ = -(uint)(fVar130 <= (float)local_518._0_4_) & local_428._4_4_
                      ;
                      local_428._8_4_ = -(uint)(fVar162 <= (float)local_518._0_4_) & local_428._8_4_
                      ;
                      local_428._12_4_ =
                           -(uint)(fVar172 <= (float)local_518._0_4_) & local_428._12_4_;
                      iVar32 = movmskps(iVar32,local_428);
                      puVar36 = (undefined1 *)CONCAT44(uVar34,iVar32);
                      prim = local_3f0;
                      pre = local_3f8;
                      pLVar44 = local_400;
                      if (iVar32 == 0) break;
                      auVar120._0_4_ = local_428._0_4_ & (uint)fVar128;
                      auVar120._4_4_ = local_428._4_4_ & (uint)fVar130;
                      auVar120._8_4_ = local_428._8_4_ & (uint)fVar162;
                      auVar120._12_4_ = local_428._12_4_ & (uint)fVar172;
                      auVar140._0_8_ =
                           CONCAT44(~local_428._4_4_,~local_428._0_4_) & 0x7f8000007f800000;
                      auVar140._8_4_ = ~local_428._8_4_ & 0x7f800000;
                      auVar140._12_4_ = ~local_428._12_4_ & 0x7f800000;
                      auVar140 = auVar140 | auVar120;
                      auVar155._4_4_ = auVar140._0_4_;
                      auVar155._0_4_ = auVar140._4_4_;
                      auVar155._8_4_ = auVar140._12_4_;
                      auVar155._12_4_ = auVar140._8_4_;
                      auVar132 = minps(auVar155,auVar140);
                      auVar121._0_8_ = auVar132._8_8_;
                      auVar121._8_4_ = auVar132._0_4_;
                      auVar121._12_4_ = auVar132._4_4_;
                      auVar132 = minps(auVar121,auVar132);
                      auVar122._0_8_ =
                           CONCAT44(-(uint)(auVar132._4_4_ == auVar140._4_4_) & local_428._4_4_,
                                    -(uint)(auVar132._0_4_ == auVar140._0_4_) & local_428._0_4_);
                      auVar122._8_4_ = -(uint)(auVar132._8_4_ == auVar140._8_4_) & local_428._8_4_;
                      auVar122._12_4_ =
                           -(uint)(auVar132._12_4_ == auVar140._12_4_) & local_428._12_4_;
                      iVar32 = movmskps(iVar32,auVar122);
                      auVar86 = local_428;
                      if (iVar32 != 0) {
                        auVar86._8_4_ = auVar122._8_4_;
                        auVar86._0_8_ = auVar122._0_8_;
                        auVar86._12_4_ = auVar122._12_4_;
                      }
                      uVar33 = movmskps(iVar32,auVar86);
                      uVar43 = CONCAT44(uVar34,uVar33);
                      lVar45 = 0;
                      if (uVar43 != 0) {
                        for (; (uVar43 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                        }
                      }
                    }
                  }
                }
                goto LAB_00a8977f;
              }
            }
          }
          lVar41 = lVar41 + 4;
        } while ((int)lVar41 < iVar6);
      }
      fVar92 = *(float *)(ray + k * 4 + 0x80);
      auVar114._4_4_ = -(uint)(fStack_44 <= fVar92);
      auVar114._0_4_ = -(uint)(local_48 <= fVar92);
      auVar114._8_4_ = -(uint)(fStack_40 <= fVar92);
      auVar114._12_4_ = -(uint)(fStack_3c <= fVar92);
      uVar46 = movmskps(uVar48,auVar114);
      uVar46 = (uint)uVar42 & uVar46;
    } while (uVar46 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }